

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  int iVar17;
  size_t sVar18;
  size_t sVar19;
  int *piVar20;
  Layer *pLVar21;
  undefined4 *puVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Allocator *pAVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  byte bVar35;
  int iVar36;
  int iVar37;
  void *pvVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  long lVar44;
  void *pvVar45;
  undefined1 (*pauVar46) [16];
  undefined1 (*pauVar47) [16];
  pointer piVar48;
  int i_1;
  uint uVar49;
  int iVar50;
  ulong uVar51;
  int iVar52;
  long lVar53;
  void *pvVar54;
  long lVar55;
  int j;
  int iVar56;
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [16];
  undefined1 (*pauVar60) [32];
  void *pvVar61;
  void *pvVar62;
  ulong uVar63;
  long lVar64;
  undefined1 (*pauVar65) [16];
  int j_2;
  uint uVar66;
  size_t _elemsize;
  pointer piVar67;
  float *pfVar68;
  void *pvVar69;
  undefined1 (*pauVar70) [16];
  pointer piVar71;
  undefined1 (*pauVar72) [16];
  pointer piVar73;
  bool bVar74;
  float fVar75;
  undefined8 uVar76;
  undefined8 uVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  int local_2f8;
  Mat local_2a8;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_238;
  undefined4 uStack_234;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  int local_218;
  undefined4 uStack_214;
  undefined8 uStack_210;
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar36 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar36;
  }
  uVar49 = bottom_blob->c;
  uVar63 = bottom_blob->elemsize;
  iVar36 = bottom_blob->elempack;
  iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar56 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar37 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar43 = (this->super_ConvolutionDepthWise).dilation_h;
  local_2a8.cstep = 0;
  local_2a8.data = (pointer)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize._0_4_ = 0;
  local_2a8.elemsize._4_4_ = 0;
  local_2a8.elempack = 0;
  local_2a8.allocator = (Allocator *)0x0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_2a8,opt);
  iVar52 = -100;
  local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258);
  local_248 = CONCAT44(local_248._4_4_,(uint)local_248);
  if (((pointer)local_2a8.data == (pointer)0x0) ||
     (local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258),
     local_248 = CONCAT44(local_248._4_4_,(uint)local_248), (long)local_2a8.c * local_2a8.cstep == 0
     )) goto LAB_003ad28c;
  iVar50 = (~((iVar50 + -1) * iVar37) + local_2a8.w) / (this->super_ConvolutionDepthWise).stride_w;
  local_258._0_4_ = iVar50 + 1;
  local_2f8 = (~((iVar56 + -1) * iVar43) + local_2a8.h) /
              (this->super_ConvolutionDepthWise).stride_h;
  local_218 = local_2f8 + 1;
  uVar66 = (this->super_ConvolutionDepthWise).num_output;
  local_238 = local_2a8.w;
  if (opt->use_packing_layout == true) {
    lVar44 = (ulong)((uVar66 & 3) == 0) * 3 + 1;
    if ((uVar66 & 7) == 0) {
      lVar44 = 8;
    }
  }
  else {
    lVar44 = 1;
  }
  local_248._0_4_ = (uint)lVar44;
  local_248._4_4_ = 0;
  _elemsize = (uVar63 / (ulong)(long)iVar36) * lVar44;
  Mat::create(top_blob,(int)local_258,local_218,(int)uVar66 / (int)(uint)local_248,_elemsize,
              (uint)local_248,opt->blob_allocator);
  uVar3 = uStack_234;
  iVar34 = local_238;
  uVar66 = (uint)local_248;
  sVar19 = local_2a8.cstep;
  iVar33 = local_2a8.c;
  iVar32 = local_2a8.d;
  iVar43 = local_2a8.h;
  iVar37 = local_2a8.w;
  pAVar31 = local_2a8.allocator;
  iVar56 = local_2a8.elempack;
  pvVar61 = top_blob->data;
  if ((pvVar61 == (void *)0x0) || (sVar18 = top_blob->cstep, (long)top_blob->c * sVar18 == 0))
  goto LAB_003ad28c;
  iVar52 = (this->super_ConvolutionDepthWise).num_output;
  iVar16 = (this->super_ConvolutionDepthWise).group;
  if (iVar16 != iVar52 || iVar36 * uVar49 != iVar16) {
LAB_003ab0d4:
    uVar63 = (long)(int)(iVar36 * uVar49) / (long)iVar16;
    uVar57 = (long)iVar52 / (long)iVar16;
    if (opt->use_packing_layout == true) {
      uVar49 = (uint)((uVar63 & 3) == 0) * 3 + 1;
      if ((uVar63 & 7) == 0) {
        uVar49 = 8;
      }
      uVar42 = (uint)((uVar57 & 3) == 0) * 3 + 1;
      if ((uVar57 & 7) == 0) {
        uVar42 = 8;
      }
    }
    else {
      uVar49 = 1;
      uVar42 = uVar49;
    }
    uVar41 = CONCAT44(local_248._4_4_,(uint)local_248);
    piVar20 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_2a8.data;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
    uVar76._4_4_ = local_2a8.w;
    uVar76._0_4_ = local_2a8.dims;
    uVar81._4_4_ = local_2a8.d;
    uVar81._0_4_ = local_2a8.h;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + 1;
      UNLOCK();
    }
    local_238 = iVar34;
    uStack_234 = uVar3;
    if ((int)uVar49 < iVar36) {
      opt_p.lightmode = opt->lightmode;
      opt_p.use_shader_pack8 = opt->use_shader_pack8;
      opt_p.use_subgroup_ops = opt->use_subgroup_ops;
      opt_p.use_reserved_0 = opt->use_reserved_0;
      opt_p.num_threads = opt->num_threads;
      opt_p.workspace_allocator = opt->workspace_allocator;
      opt_p.openmp_blocktime = opt->openmp_blocktime;
      opt_p.use_winograd_convolution = opt->use_winograd_convolution;
      opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_p.use_int8_inference = opt->use_int8_inference;
      opt_p.use_vulkan_compute = opt->use_vulkan_compute;
      opt_p.use_bf16_storage = opt->use_bf16_storage;
      opt_p.use_fp16_packed = opt->use_fp16_packed;
      opt_p.use_fp16_storage = opt->use_fp16_storage;
      opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_p.use_int8_packed = opt->use_int8_packed;
      opt_p.use_int8_storage = opt->use_int8_storage;
      opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_p.use_packing_layout = opt->use_packing_layout;
      opt_p.vulkan_device_index = opt->vulkan_device_index;
      opt_p.use_reserved_1 = opt->use_reserved_1;
      opt_p.use_image_storage = opt->use_image_storage;
      opt_p.use_tensor_storage = opt->use_tensor_storage;
      opt_p.use_reserved_2 = opt->use_reserved_2;
      opt_p.flush_denormals = opt->flush_denormals;
      opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_p.use_shader_local_memory = opt->use_shader_local_memory;
      opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_p.use_fp16_uniform = opt->use_fp16_uniform;
      opt_p.use_int8_uniform = opt->use_int8_uniform;
      opt_p.use_reserved_9 = opt->use_reserved_9;
      opt_p.use_reserved_10 = opt->use_reserved_10;
      opt_p.use_reserved_11 = opt->use_reserved_11;
      opt_p.blob_allocator = opt->workspace_allocator;
      convert_packing(&local_2a8,(Mat *)&_space_ofs,uVar49,&opt_p);
      if ((_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start != (pointer)0x0) && ((long)iVar33 * sVar19 != 0)) goto LAB_003ab237;
      iVar52 = -100;
    }
    else {
LAB_003ab237:
      piVar20 = top_blob->refcount;
      opt_p._0_8_ = top_blob->data;
      opt_p.blob_allocator = (Allocator *)top_blob->refcount;
      opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
      opt_p.openmp_blocktime = top_blob->elempack;
      opt_p._32_8_ = top_blob->allocator;
      opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
      opt_p._48_8_ = *(undefined8 *)&top_blob->h;
      opt_p._56_4_ = top_blob->c;
      sVar18 = top_blob->cstep;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      if (uVar42 < uVar66) {
        Mat::create((Mat *)&opt_p,(int)local_258,local_218,
                    (this->super_ConvolutionDepthWise).num_output / (int)uVar42,
                    (ulong)uVar42 * (_elemsize / uVar41),uVar42,opt->workspace_allocator);
        iVar52 = -100;
        if ((opt_p._0_8_ != 0) && ((long)(int)opt_p._56_4_ * sVar18 != 0)) goto LAB_003ab315;
      }
      else {
LAB_003ab315:
        iVar50 = 0;
        iVar36 = 0;
        lVar44 = 0;
        do {
          if ((this->super_ConvolutionDepthWise).group <= lVar44) {
            if (uVar42 < (uint)local_248) {
              convert_packing((Mat *)&opt_p,top_blob,(uint)local_248,opt);
              iVar52 = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              break;
            }
            else if ((Mat *)&opt_p != top_blob) {
              if (opt_p.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                     *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                UNLOCK();
              }
              piVar20 = top_blob->refcount;
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data = (void *)opt_p._0_8_;
              top_blob->refcount = (int *)opt_p.blob_allocator;
              top_blob->elemsize = (size_t)opt_p.workspace_allocator;
              top_blob->elempack = opt_p.openmp_blocktime;
              top_blob->allocator = (Allocator *)opt_p._32_8_;
              *(undefined8 *)&top_blob->dims = opt_p._40_8_;
              *(undefined8 *)&top_blob->h = opt_p._48_8_;
              top_blob->c = opt_p._56_4_;
              top_blob->cstep = sVar18;
            }
            iVar52 = 0;
            break;
          }
          m.c = (int)uVar63 / (int)uVar49;
          m.data = (void *)((long)(iVar50 / (int)uVar49) * sVar19 *
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
          m.refcount = (int *)0x0;
          m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          m.elempack = iVar56;
          m.allocator = pAVar31;
          m.cstep = ((long)iVar32 *
                     (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage * (long)iVar43 * (long)iVar37 +
                     0xfU & 0xfffffffffffffff0) /
                    (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          m_1.c = (int)uVar57 / (int)uVar42;
          m_1.data = (void *)((long)(iVar36 / (int)uVar42) * sVar18 *
                              (long)opt_p.workspace_allocator + opt_p._0_8_);
          m_1.refcount = (int *)0x0;
          m_1.elemsize = (size_t)opt_p.workspace_allocator;
          m_1.elempack = opt_p.openmp_blocktime;
          m_1.allocator = (Allocator *)opt_p._32_8_;
          m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                       (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                      0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
          m_1._40_8_ = opt_p._40_8_;
          m_1._48_8_ = opt_p._48_8_;
          pLVar21 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar44];
          opt_g.lightmode = opt->lightmode;
          opt_g.use_shader_pack8 = opt->use_shader_pack8;
          opt_g.use_subgroup_ops = opt->use_subgroup_ops;
          opt_g.use_reserved_0 = opt->use_reserved_0;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.openmp_blocktime = opt->openmp_blocktime;
          opt_g.use_winograd_convolution = opt->use_winograd_convolution;
          opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
          opt_g.use_int8_inference = opt->use_int8_inference;
          opt_g.use_vulkan_compute = opt->use_vulkan_compute;
          opt_g.use_bf16_storage = opt->use_bf16_storage;
          opt_g.use_fp16_packed = opt->use_fp16_packed;
          opt_g.use_fp16_storage = opt->use_fp16_storage;
          opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_g.use_int8_packed = opt->use_int8_packed;
          opt_g.use_int8_storage = opt->use_int8_storage;
          opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_g.use_packing_layout = opt->use_packing_layout;
          opt_g.vulkan_device_index = opt->vulkan_device_index;
          opt_g.use_reserved_1 = opt->use_reserved_1;
          opt_g.use_image_storage = opt->use_image_storage;
          opt_g.use_tensor_storage = opt->use_tensor_storage;
          opt_g.use_reserved_2 = opt->use_reserved_2;
          opt_g.flush_denormals = opt->flush_denormals;
          opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
          opt_g.use_shader_local_memory = opt->use_shader_local_memory;
          opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
          opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
          opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
          opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
          opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          opt_g.use_fp16_uniform = opt->use_fp16_uniform;
          opt_g.use_int8_uniform = opt->use_int8_uniform;
          opt_g.use_reserved_9 = opt->use_reserved_9;
          opt_g.use_reserved_10 = opt->use_reserved_10;
          opt_g.use_reserved_11 = opt->use_reserved_11;
          opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
          m._40_8_ = uVar76;
          m._48_8_ = uVar81;
          iVar52 = (*pLVar21->_vptr_Layer[7])(pLVar21,&m,&m_1,&opt_g);
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m.refcount != (int *)0x0) {
            LOCK();
            *m.refcount = *m.refcount + -1;
            UNLOCK();
            if (*m.refcount == 0) {
              if (m.allocator == (Allocator *)0x0) {
                free(m.data);
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar44 = lVar44 + 1;
          iVar36 = iVar36 + (int)uVar57;
          iVar50 = iVar50 + (int)uVar63;
        } while (iVar52 == 0);
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
    }
    local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258);
    local_248 = CONCAT44(local_248._4_4_,(uint)local_248);
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      LOCK();
      *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      UNLOCK();
      local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258);
      local_248 = CONCAT44(local_248._4_4_,(uint)local_248);
      if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish == 0) {
        if (pAVar31 == (Allocator *)0x0) {
          free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
        else {
          (*pAVar31->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_003ad28c;
  }
  if (iVar36 == 1) {
    auVar132._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar132._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar132._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar132._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar132 = vpcmpeqd_avx(auVar132,_DAT_0053a200);
    uVar42 = vmovmskps_avx(auVar132);
    iVar50 = (this->super_ConvolutionDepthWise).stride_w;
    iVar17 = (this->super_ConvolutionDepthWise).stride_h;
    local_238 = (int)local_2a8.data;
    uStack_234 = (undefined4)((ulong)local_2a8.data >> 0x20);
    if (iVar17 == 1 && (iVar50 == 1 && (uVar42 ^ 0xf) == 0)) {
      lVar44 = (long)local_2a8.w;
      iVar36 = top_blob->w;
      iVar50 = top_blob->h;
      pvVar69 = (this->super_ConvolutionDepthWise).bias_data.data;
      sVar19 = top_blob->elemsize;
      pvVar38 = (this->weight_data_tm).data;
      local_228._0_8_ = lVar44 * 2;
      local_248 = (long)local_2a8.w;
      uVar63 = 0;
      uVar49 = local_2a8.c;
      if (local_2a8.c < 1) {
        uVar49 = 0;
      }
      local_258 = (void *)(ulong)uVar49;
      lVar55 = (long)(local_2a8.w + 2) * 4;
      local_218 = (int)pvVar69;
      uStack_214 = (undefined4)((ulong)pvVar69 >> 0x20);
      for (; uVar63 != uVar49; uVar63 = uVar63 + 1) {
        if (pvVar69 == (void *)0x0) {
          fVar75 = 0.0;
        }
        else {
          fVar75 = *(float *)((long)pvVar69 + uVar63 * 4);
        }
        pvVar54 = (void *)(sVar18 * sVar19 * uVar63 + (long)pvVar61);
        lVar53 = uVar63 * 0x24;
        piVar73 = (pointer)(CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) *
                            local_2a8.cstep * uVar63 + (long)local_2a8.data);
        piVar67 = piVar73 + local_2a8.w;
        piVar71 = piVar73 + lVar44 * 2;
        piVar48 = piVar73 + lVar44 * 3;
        pvVar45 = pvVar54;
        for (uVar66 = 0; (int)(uVar66 | 1) < iVar50; uVar66 = uVar66 + 2) {
          lVar64 = 0;
          for (iVar56 = iVar36; 0 < iVar56; iVar56 = iVar56 + -1) {
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)((long)piVar73 + lVar64 + 4);
            auVar132 = vmovlhps_avx(ZEXT416(*(uint *)((long)piVar73 + lVar64)),auVar86);
            auVar132 = vshufps_avx(auVar132,auVar86,0xd8);
            auVar84 = vinsertps_avx(auVar132,ZEXT416((uint)*(float *)((long)piVar67 + lVar64)),0x30)
            ;
            auVar132 = *(undefined1 (*) [16])((long)pvVar38 + lVar53);
            pfVar68 = (float *)((long)pvVar38 + lVar53 + 0x10);
            auVar122._8_8_ = 0;
            auVar122._0_8_ = *(ulong *)((long)piVar67 + lVar64 + 4);
            auVar102 = vinsertps_avx(auVar122,ZEXT416(*(uint *)((long)piVar71 + lVar64)),0x20);
            auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)((long)piVar71 + lVar64 + 4)),0x30);
            auVar127._0_4_ = *pfVar68 * auVar102._0_4_;
            auVar127._4_4_ = pfVar68[1] * auVar102._4_4_;
            auVar127._8_4_ = pfVar68[2] * auVar102._8_4_;
            auVar127._12_4_ = pfVar68[3] * auVar102._12_4_;
            auVar102 = vhaddps_avx(auVar127,auVar127);
            auVar142._0_4_ = auVar132._0_4_ * auVar84._0_4_;
            auVar142._4_4_ = auVar132._4_4_ * auVar84._4_4_;
            auVar142._8_4_ = auVar132._8_4_ * auVar84._8_4_;
            auVar142._12_4_ = auVar132._12_4_ * auVar84._12_4_;
            auVar102 = vhaddps_avx(auVar102,auVar102);
            auVar84 = vhaddps_avx(auVar142,auVar142);
            auVar84 = vhaddps_avx(auVar84,auVar84);
            auVar142 = ZEXT416(*(uint *)((long)pvVar38 + lVar53 + 0x20));
            auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar84._0_4_)),auVar142,
                                      ZEXT416(*(uint *)((long)piVar71 + lVar64 + 8)));
            auVar102 = vmovlhps_avx(auVar132,auVar122);
            auVar102 = vshufps_avx(auVar102,auVar122,0xd8);
            auVar84 = vinsertps_avx(auVar102,ZEXT416(*(uint *)((long)piVar71 + lVar64)),0x30);
            auVar125._8_8_ = 0;
            auVar125._0_8_ = *(ulong *)((long)piVar71 + lVar64 + 4);
            auVar102 = vmovhps_avx(auVar125,*(undefined8 *)((long)piVar48 + lVar64));
            auVar113._0_4_ = auVar102._0_4_ * *pfVar68;
            auVar113._4_4_ = auVar102._4_4_ * pfVar68[1];
            auVar113._8_4_ = auVar102._8_4_ * pfVar68[2];
            auVar113._12_4_ = auVar102._12_4_ * pfVar68[3];
            auVar102 = vhaddps_avx(auVar113,auVar113);
            auVar102 = vhaddps_avx(auVar102,auVar102);
            auVar95._0_4_ = auVar84._0_4_ * *(float *)((long)piVar67 + lVar64);
            auVar95._4_4_ = auVar84._4_4_ * auVar132._4_4_;
            auVar95._8_4_ = auVar84._8_4_ * auVar132._8_4_;
            auVar95._12_4_ = auVar84._12_4_ * auVar132._12_4_;
            auVar132 = vhaddps_avx(auVar95,auVar95);
            auVar132 = vhaddps_avx(auVar132,auVar132);
            auVar132 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar132._0_4_)),auVar142,
                                       ZEXT416(*(uint *)((long)piVar48 + lVar64 + 8)));
            *(float *)((long)pvVar45 + lVar64) = auVar86._0_4_ + fVar75;
            *(float *)((long)pvVar54 + lVar64 + (long)iVar36 * 4) = auVar132._0_4_ + fVar75;
            lVar64 = lVar64 + 4;
          }
          piVar73 = (pointer)((long)piVar73 + lVar64 + lVar55);
          piVar67 = (pointer)((long)piVar67 + lVar64 + lVar55);
          piVar71 = (pointer)((long)piVar71 + lVar64 + lVar55);
          piVar48 = (pointer)((long)piVar48 + lVar64 + lVar55);
          pvVar45 = (void *)((long)pvVar45 + lVar64 + (long)iVar36 * 4);
          pvVar54 = (void *)((long)pvVar54 + lVar64 + (long)iVar36 * 4);
        }
        for (; (int)uVar66 < iVar50; uVar66 = uVar66 + 1) {
          lVar64 = 0;
          for (iVar56 = iVar36; 0 < iVar56; iVar56 = iVar56 + -1) {
            auVar82._8_8_ = 0;
            auVar82._0_8_ = *(ulong *)((long)piVar73 + lVar64);
            auVar132 = vinsertps_avx(auVar82,ZEXT416(*(uint *)((long)piVar73 + lVar64 + 8)),0x20);
            auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)((long)piVar67 + lVar64)),0x30);
            auVar110._16_8_ = *(undefined8 *)((long)piVar67 + lVar64 + 4);
            auVar110._0_16_ = auVar132;
            auVar110._24_8_ = 0;
            auVar93._16_8_ = *(undefined8 *)((long)piVar71 + lVar64);
            auVar93._0_16_ = auVar132;
            auVar93._24_8_ = 0;
            auVar94 = vshufpd_avx(auVar110,auVar93,2);
            pfVar68 = (float *)((long)pvVar38 + lVar53);
            auVar83._0_4_ = auVar94._0_4_ * *pfVar68;
            auVar83._4_4_ = auVar94._4_4_ * pfVar68[1];
            auVar83._8_4_ = auVar94._8_4_ * pfVar68[2];
            auVar83._12_4_ = auVar94._12_4_ * pfVar68[3];
            auVar8._16_4_ = auVar94._16_4_ * pfVar68[4];
            auVar8._0_16_ = auVar83;
            auVar8._20_4_ = auVar94._20_4_ * pfVar68[5];
            auVar8._24_4_ = auVar94._24_4_ * pfVar68[6];
            auVar8._28_4_ = auVar94._28_4_;
            auVar132 = vhaddps_avx(auVar8._16_16_,auVar83);
            auVar132 = vhaddps_avx(auVar132,auVar132);
            auVar132 = vhaddps_avx(auVar132,auVar132);
            auVar132 = vfmadd231ss_fma(auVar132,ZEXT416(*(uint *)((long)pvVar38 + lVar53 + 0x20)),
                                       ZEXT416(*(uint *)((long)piVar71 + lVar64 + 8)));
            *(float *)((long)pvVar45 + lVar64) = auVar132._0_4_ + fVar75;
            lVar64 = lVar64 + 4;
          }
          piVar73 = (pointer)((long)piVar73 + lVar64 + 8);
          piVar67 = (pointer)((long)piVar67 + lVar64 + 8);
          piVar71 = (pointer)((long)piVar71 + lVar64 + 8);
          pvVar45 = (void *)((long)pvVar45 + lVar64);
        }
      }
    }
    else {
      if ((iVar17 != 2 || iVar50 != 2) || (char)(uVar42 ^ 0xf) != '\0') goto LAB_003ab0d4;
      iVar36 = top_blob->w;
      pvVar69 = (this->super_ConvolutionDepthWise).bias_data.data;
      pvVar38 = (this->weight_data_tm).data;
      sVar19 = top_blob->elemsize;
      local_258 = (void *)(CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) *
                          local_2a8.cstep);
      local_248 = (long)local_2a8.w * 2;
      uVar63 = 0;
      iVar50 = top_blob->h;
      if (top_blob->h < 1) {
        iVar50 = 0;
      }
      uVar57 = (ulong)(uint)local_2a8.c;
      if (local_2a8.c < 1) {
        uVar57 = uVar63;
      }
      lVar44 = (long)((local_2a8.w - iVar36) * 2) * 4;
      for (; local_238 = iVar34, uStack_234 = uVar3, uVar63 != uVar57; uVar63 = uVar63 + 1) {
        if (pvVar69 == (void *)0x0) {
          fVar75 = 0.0;
        }
        else {
          fVar75 = *(float *)((long)pvVar69 + uVar63 * 4);
        }
        pfVar68 = (float *)(sVar18 * sVar19 * uVar63 + (long)pvVar61);
        piVar71 = (pointer)((long)local_258 * uVar63 + (long)local_2a8.data);
        piVar67 = piVar71 + local_2a8.w;
        piVar48 = piVar71 + (long)local_2a8.w * 2;
        for (iVar56 = 0; iVar56 != iVar50; iVar56 = iVar56 + 1) {
          lVar55 = 0;
          for (iVar37 = iVar36; 0 < iVar37; iVar37 = iVar37 + -1) {
            auVar102._8_8_ = 0;
            auVar102._0_8_ = *(ulong *)((long)piVar71 + lVar55);
            auVar132 = vinsertps_avx(auVar102,ZEXT416(*(uint *)((long)piVar71 + lVar55 + 8)),0x20);
            auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)((long)piVar67 + lVar55)),0x30);
            auVar111._16_8_ = *(undefined8 *)((long)piVar67 + lVar55 + 4);
            auVar111._0_16_ = auVar132;
            auVar111._24_8_ = 0;
            auVar94._16_8_ = *(undefined8 *)((long)piVar48 + lVar55);
            auVar94._0_16_ = auVar132;
            auVar94._24_8_ = 0;
            auVar94 = vshufpd_avx(auVar111,auVar94,2);
            pfVar2 = (float *)((long)pvVar38 + uVar63 * 0x24);
            auVar84._0_4_ = auVar94._0_4_ * *pfVar2;
            auVar84._4_4_ = auVar94._4_4_ * pfVar2[1];
            auVar84._8_4_ = auVar94._8_4_ * pfVar2[2];
            auVar84._12_4_ = auVar94._12_4_ * pfVar2[3];
            auVar7._16_4_ = auVar94._16_4_ * pfVar2[4];
            auVar7._0_16_ = auVar84;
            auVar7._20_4_ = auVar94._20_4_ * pfVar2[5];
            auVar7._24_4_ = auVar94._24_4_ * pfVar2[6];
            auVar7._28_4_ = auVar94._28_4_;
            auVar132 = vhaddps_avx(auVar7._16_16_,auVar84);
            auVar132 = vhaddps_avx(auVar132,auVar132);
            auVar132 = vhaddps_avx(auVar132,auVar132);
            auVar132 = vfmadd231ss_fma(auVar132,ZEXT416(*(uint *)((long)pvVar38 +
                                                                 uVar63 * 0x24 + 0x20)),
                                       ZEXT416(*(uint *)((long)piVar48 + lVar55 + 8)));
            *pfVar68 = auVar132._0_4_ + fVar75;
            pfVar68 = pfVar68 + 1;
            lVar55 = lVar55 + 8;
          }
          piVar71 = (pointer)((long)piVar71 + lVar55 + lVar44);
          piVar67 = (pointer)((long)piVar67 + lVar55 + lVar44);
          piVar48 = (pointer)((long)piVar48 + lVar55 + lVar44);
        }
      }
    }
LAB_003ac98f:
    pLVar21 = this->activation;
    if (pLVar21 != (Layer *)0x0) {
      (*pLVar21->_vptr_Layer[9])(pLVar21,top_blob,opt);
    }
  }
  else {
    if (iVar36 != 4) {
      if (iVar36 != 8) goto LAB_003ab0d4;
      auVar26._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar26._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar26._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar26._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      auVar132 = vpcmpeqd_avx(auVar26,_DAT_0053a200);
      iVar37 = vmovmskps_avx(auVar132);
      iVar36 = (this->super_ConvolutionDepthWise).stride_w;
      iVar56 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar56 == 1 && (iVar36 == 1 && iVar37 == 0xf)) {
        iVar36 = top_blob->w;
        iVar50 = top_blob->h;
        pvVar61 = (this->super_ConvolutionDepthWise).bias_data.data;
        uVar57 = 0;
        uVar63 = (ulong)(uint)local_2a8.c;
        if (local_2a8.c < 1) {
          uVar63 = uVar57;
        }
        lVar44 = (long)(iVar36 * 8) * 4;
        lVar55 = (long)(local_2a8.w * 8 + 0x10) * 4;
        for (; local_238 = iVar34, uStack_234 = uVar3,
            local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258),
            local_248 = CONCAT44(local_248._4_4_,(uint)local_248), uVar57 != uVar63;
            uVar57 = uVar57 + 1) {
          if (pvVar61 == (void *)0x0) {
            auVar94 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar94 = *(undefined1 (*) [32])((long)pvVar61 + uVar57 * 0x20);
          }
          pvVar62 = (void *)(top_blob->cstep * uVar57 * top_blob->elemsize + (long)top_blob->data);
          lVar64 = (long)(this->weight_data_tm).w * uVar57 * (this->weight_data_tm).elemsize;
          pvVar38 = (this->weight_data_tm).data;
          pvVar45 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar62);
          piVar71 = (pointer)(local_2a8.cstep * uVar57 *
                              CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) +
                             (long)local_2a8.data);
          lVar53 = (long)local_2a8.w *
                   CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
          piVar67 = (pointer)((long)piVar71 + lVar53);
          pvVar69 = (void *)((long)piVar71 + lVar53 * 2);
          pvVar54 = (void *)(lVar53 * 3 + (long)piVar71);
          for (uVar49 = 0; (int)(uVar49 | 1) < iVar50; uVar49 = uVar49 + 2) {
            lVar53 = 0;
            for (iVar56 = 0; iVar56 + 3 < iVar36; iVar56 = iVar56 + 4) {
              auVar7 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x20);
              auVar111 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x40);
              auVar8 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x60);
              auVar93 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x80);
              auVar110 = *(undefined1 (*) [32])((long)pvVar38 + lVar64);
              auVar9 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x20);
              auVar10 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x40);
              auVar11 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x60);
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar53),auVar110,
                                         auVar94);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar7);
              auVar132 = vfmadd213ps_fma(auVar7,auVar110,auVar94);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar111);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,auVar111);
              auVar132 = vfmadd213ps_fma(auVar111,auVar110,auVar94);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar8);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar10,auVar8);
              auVar132 = vfmadd213ps_fma(auVar8,auVar110,auVar94);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar93);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar10,auVar93);
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0xa0));
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x80);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xa0);
              auVar8 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x20);
              auVar93 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x40);
              auVar12 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x60);
              auVar13 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x80);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar11,
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53));
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar67 + lVar53),auVar110,
                                         auVar94);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar11,auVar8);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar8);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar7,auVar8);
              auVar132 = vfmadd213ps_fma(auVar8,auVar110,auVar94);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar11,auVar93);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar93);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar7,auVar93);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar10,auVar93);
              auVar122 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,auVar93);
              auVar132 = vfmadd213ps_fma(auVar93,auVar110,auVar94);
              auVar102 = vfmadd213ps_fma(auVar110,auVar12,auVar94);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar12);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar13,auVar9);
              auVar8 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0xa0);
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar11,auVar12);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar7,auVar12);
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar7,auVar13);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar10,auVar12);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,auVar13);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar8,auVar10);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar111,auVar12);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar111,auVar13);
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar111,auVar8);
              auVar8 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x20);
              auVar93 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x40);
              auVar110 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x60);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar11,
                                        *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar11,auVar8);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar11,auVar93);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,auVar11);
              auVar9 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xc0);
              auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar9,
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar10 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x80);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar7,auVar8);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar7,auVar93);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,auVar110);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,auVar7);
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xe0);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar9,auVar8);
              auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar7,auVar8);
              auVar8 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0xa0);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar111,auVar93);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar111,auVar110);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar10);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar8,auVar111);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x100);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar9,auVar93);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar7,auVar93);
              auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar111,auVar93);
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar9,auVar110);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar7,auVar110);
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar7,auVar10);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar111,auVar110);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar111,auVar10);
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar111,auVar8);
              auVar8 = *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x20);
              auVar93 = *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x40);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar9,
                                        *(undefined1 (*) [32])((long)pvVar54 + lVar53));
              auVar110 = *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x60);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar9,auVar8);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar93);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,auVar9);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar7,auVar8);
              auVar8 = *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x80);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar7,auVar93);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,auVar110);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar8,auVar7);
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar111,auVar93);
              auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar111,auVar110);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar8);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,
                                         *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0xa0));
              *(undefined1 (*) [32])((long)pvVar62 + lVar53) = ZEXT1632(auVar122);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x20) = ZEXT1632(auVar84);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x40) = ZEXT1632(auVar86);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x60) = ZEXT1632(auVar142);
              *(undefined1 (*) [32])((long)pvVar45 + lVar53) = ZEXT1632(auVar95);
              *(undefined1 (*) [32])((long)pvVar45 + lVar53 + 0x20) = ZEXT1632(auVar113);
              *(undefined1 (*) [32])((long)pvVar45 + lVar53 + 0x40) = ZEXT1632(auVar132);
              *(undefined1 (*) [32])((long)pvVar45 + lVar53 + 0x60) = ZEXT1632(auVar102);
              lVar53 = lVar53 + 0x80;
            }
            for (; iVar56 + 1 < iVar36; iVar56 = iVar56 + 2) {
              auVar7 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x20);
              auVar111 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x40);
              auVar8 = *(undefined1 (*) [32])((long)pvVar38 + lVar64);
              auVar93 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x20);
              auVar110 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x40);
              auVar9 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x60);
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar53),auVar8,
                                         auVar94);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar7);
              auVar132 = vfmadd213ps_fma(auVar7,auVar8,auVar94);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar111);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,auVar111);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x60));
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x80);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xa0);
              auVar10 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x20);
              auVar11 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x40);
              auVar12 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x60);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar9,
                                        *(undefined1 (*) [32])((long)piVar67 + lVar53));
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar10);
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar67 + lVar53),auVar8,
                                         auVar94);
              auVar102 = vfmadd213ps_fma(auVar8,auVar10,auVar94);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar7,auVar10);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar7,auVar11);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar10);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar11,auVar93);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar111,auVar11);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar111,auVar12);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,auVar11);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,auVar12);
              auVar8 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xc0);
              auVar93 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xe0);
              auVar110 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x100);
              auVar10 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x20);
              auVar11 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x40);
              auVar12 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x60);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar8,
                                        *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar8,auVar10);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,auVar9);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar93,auVar10);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar93,auVar11);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,auVar10);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar11,auVar7);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar110,auVar11);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar110,auVar12);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar11);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,auVar12);
              auVar7 = *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x20);
              auVar111 = *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x40);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,
                                         *(undefined1 (*) [32])((long)pvVar54 + lVar53));
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar7,auVar8);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar7);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,auVar93);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,auVar111);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,
                                         *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x60));
              *(undefined1 (*) [32])((long)pvVar62 + lVar53) = ZEXT1632(auVar84);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x20) = ZEXT1632(auVar86);
              *(undefined1 (*) [32])((long)pvVar45 + lVar53) = ZEXT1632(auVar132);
              *(undefined1 (*) [32])((long)pvVar45 + lVar53 + 0x20) = ZEXT1632(auVar102);
              lVar53 = lVar53 + 0x40;
            }
            for (; iVar56 < iVar36; iVar56 = iVar56 + 1) {
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x20);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x40);
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar53),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64),auVar94);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x20));
              auVar8 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x60);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x40));
              auVar93 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x80);
              auVar110 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xa0);
              auVar9 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x20);
              auVar10 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x40);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53));
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar67 + lVar53),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64),auVar94);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar93,auVar9);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,auVar9);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,auVar10);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar10);
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xc0);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xe0);
              auVar9 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x100);
              auVar10 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x20);
              auVar11 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x40);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar7,
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,auVar10);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar10);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar9,auVar11);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,auVar11);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,
                                         *(undefined1 (*) [32])((long)pvVar54 + lVar53));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                         *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x20));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,
                                         *(undefined1 (*) [32])((long)pvVar54 + lVar53 + 0x40));
              *(undefined1 (*) [32])((long)pvVar62 + lVar53) = ZEXT1632(auVar102);
              *(undefined1 (*) [32])((long)pvVar45 + lVar53) = ZEXT1632(auVar132);
              lVar53 = lVar53 + 0x20;
            }
            piVar71 = (pointer)((long)piVar71 + lVar53 + lVar55);
            piVar67 = (pointer)((long)piVar67 + lVar53 + lVar55);
            pvVar69 = (void *)((long)pvVar69 + lVar53 + lVar55);
            pvVar54 = (void *)((long)pvVar54 + lVar53 + lVar55);
            pvVar62 = (void *)((long)pvVar62 + lVar53 + lVar44);
            pvVar45 = (void *)((long)pvVar45 + lVar53 + lVar44);
          }
          for (; (int)uVar49 < iVar50; uVar49 = uVar49 + 1) {
            lVar53 = 0;
            for (iVar56 = 0; iVar56 + 3 < iVar36; iVar56 = iVar56 + 4) {
              auVar7 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x20);
              auVar111 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x40);
              auVar8 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x60);
              auVar93 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x80);
              auVar110 = *(undefined1 (*) [32])((long)pvVar38 + lVar64);
              auVar9 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x20);
              auVar10 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x40);
              auVar11 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x60);
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar53),auVar110,
                                         auVar94);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar7);
              auVar132 = vfmadd213ps_fma(auVar7,auVar110,auVar94);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar111);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,auVar111);
              auVar132 = vfmadd213ps_fma(auVar111,auVar110,auVar94);
              auVar102 = vfmadd213ps_fma(auVar110,auVar8,auVar94);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar8);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar93,auVar9);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar10,auVar8);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0xa0));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,auVar93);
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x80);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xa0);
              auVar8 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x20);
              auVar93 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x40);
              auVar110 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x60);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar11,
                                        *(undefined1 (*) [32])((long)piVar67 + lVar53));
              auVar9 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x80);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar11,auVar8);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar11,auVar93);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,auVar11);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar7,auVar8);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar7,auVar93);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,auVar110);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar9,auVar7);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar111,auVar93);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar111,auVar110);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0xa0));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar9);
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xc0);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xe0);
              auVar8 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x100);
              auVar93 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x20);
              auVar110 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x40);
              auVar9 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x60);
              auVar10 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x80);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar7,
                                        *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar7,auVar93);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,auVar110);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar9,auVar7);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar111,auVar93);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar111,auVar110);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar9);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,auVar111);
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar8,auVar110);
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar8,auVar9);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,auVar10);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar8,
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0xa0));
              *(undefined1 (*) [32])((long)pvVar62 + lVar53) = ZEXT1632(auVar86);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x20) = ZEXT1632(auVar84);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x40) = ZEXT1632(auVar132);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x60) = ZEXT1632(auVar102);
              lVar53 = lVar53 + 0x80;
            }
            for (; iVar56 + 1 < iVar36; iVar56 = iVar56 + 2) {
              auVar7 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x20);
              auVar111 = *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x40);
              auVar8 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x20);
              auVar93 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x40);
              auVar110 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x60);
              auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar53),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64),auVar94);
              auVar102 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar64),auVar7,
                                         auVar94);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,auVar7);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,auVar8);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar111);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar93,
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x60));
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x80);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xa0);
              auVar8 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x20);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53));
              auVar93 = *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x40);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar8,auVar110);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,auVar8);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar93,auVar7);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar93);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x60));
              auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xc0);
              auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xe0);
              auVar8 = *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x100);
              auVar93 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x20);
              auVar110 = *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x40);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar7,
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar93,auVar7);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,auVar93);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,auVar111);
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,auVar110);
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar8,
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x60));
              *(undefined1 (*) [32])((long)pvVar62 + lVar53) = ZEXT1632(auVar132);
              *(undefined1 (*) [32])((long)pvVar62 + lVar53 + 0x20) = ZEXT1632(auVar102);
              lVar53 = lVar53 + 0x40;
            }
            for (; iVar56 < iVar36; iVar56 = iVar56 + 1) {
              auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar64),auVar94,
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x20),
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x20));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x40),
                                         *(undefined1 (*) [32])((long)piVar71 + lVar53 + 0x40));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x60),
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x80),
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x20));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xa0),
                                         *(undefined1 (*) [32])((long)piVar67 + lVar53 + 0x40));
              auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xc0),
                                         ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0xe0),
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x20));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar64 + 0x100),
                                         *(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x40));
              *(undefined1 (*) [32])((long)pvVar62 + lVar53) = ZEXT1632(auVar132);
              lVar53 = lVar53 + 0x20;
            }
            piVar71 = (pointer)((long)piVar71 + lVar53 + 0x40);
            piVar67 = (pointer)((long)piVar67 + lVar53 + 0x40);
            pvVar69 = (void *)((long)pvVar69 + lVar53 + 0x40);
            pvVar62 = (void *)((long)pvVar62 + lVar53);
          }
        }
      }
      else {
        bVar35 = (byte)iVar37;
        if ((iVar56 == 2 && iVar36 == 2) && bVar35 == 0xf) {
          iVar36 = top_blob->w;
          pvVar61 = (this->super_ConvolutionDepthWise).bias_data.data;
          uVar57 = 0;
          uVar63 = (ulong)(uint)top_blob->h;
          if (top_blob->h < 1) {
            uVar63 = uVar57;
          }
          uVar41 = (ulong)(uint)local_2a8.c;
          if (local_2a8.c < 1) {
            uVar41 = uVar57;
          }
          lVar44 = (long)((local_2a8.w - iVar36) * 0x10) * 4;
          for (; local_238 = iVar34, uStack_234 = uVar3,
              local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258),
              local_248 = CONCAT44(local_248._4_4_,(uint)local_248), uVar57 != uVar41;
              uVar57 = uVar57 + 1) {
            if (pvVar61 == (void *)0x0) {
              auVar94 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            }
            else {
              auVar94 = *(undefined1 (*) [32])((long)pvVar61 + uVar57 * 0x20);
            }
            pauVar60 = (undefined1 (*) [32])
                       (top_blob->cstep * uVar57 * top_blob->elemsize + (long)top_blob->data);
            pvVar38 = (this->weight_data_tm).data;
            lVar53 = (long)(this->weight_data_tm).w * uVar57 * (this->weight_data_tm).elemsize;
            piVar71 = (pointer)(local_2a8.cstep * uVar57 *
                                CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) +
                               (long)local_2a8.data);
            lVar55 = (long)local_2a8.w *
                     CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
            piVar67 = (pointer)((long)piVar71 + lVar55);
            pvVar69 = (void *)((long)piVar71 + lVar55 * 2);
            auVar7 = *(undefined1 (*) [32])((long)pvVar38 + lVar53);
            auVar111 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x20);
            auVar8 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x40);
            auVar93 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x60);
            auVar110 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x80);
            auVar9 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0xa0);
            auVar10 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0xc0);
            auVar11 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0xe0);
            auVar12 = *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x100);
            for (iVar50 = 0; iVar50 != (int)uVar63; iVar50 = iVar50 + 1) {
              lVar55 = 0;
              for (iVar56 = 0; iVar56 + 3 < iVar36; iVar56 = iVar56 + 4) {
                auVar13 = *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x40);
                auVar14 = *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x80);
                auVar15 = *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0xc0);
                auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar55),auVar7,
                                           auVar94);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x20));
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,auVar13);
                auVar132 = vfmadd213ps_fma(auVar13,auVar7,auVar94);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x60));
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,auVar14);
                auVar132 = vfmadd213ps_fma(auVar14,auVar7,auVar94);
                auVar102 = vfmadd213ps_fma(auVar15,auVar7,auVar94);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0xa0));
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0xe0));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,auVar15);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar8,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x100));
                auVar13 = *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x40);
                auVar14 = *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x80);
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar93,
                                          *(undefined1 (*) [32])((long)piVar67 + lVar55));
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar93,auVar13);
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar110,
                                          *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x20));
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar9,auVar13);
                auVar13 = *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0xc0);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar14);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar93,auVar13);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar110,
                                          *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x60));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0xa0));
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0xe0));
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar9,auVar14);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,auVar13);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar9,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x100));
                auVar13 = *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x40);
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar10,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar55));
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar10,auVar13);
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar11,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20));
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar12,auVar13);
                auVar13 = *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x80);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,auVar13);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar11,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x60));
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar12,auVar13);
                auVar13 = *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0xc0);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,auVar13);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar11,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0xa0));
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar11,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0xe0));
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar12,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x100));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar12,auVar13);
                *pauVar60 = ZEXT1632(auVar84);
                pauVar60[1] = ZEXT1632(auVar86);
                pauVar60[2] = ZEXT1632(auVar132);
                pauVar60[3] = ZEXT1632(auVar102);
                pauVar60 = pauVar60 + 4;
                lVar55 = lVar55 + 0x100;
              }
              for (; iVar56 + 1 < iVar36; iVar56 = iVar56 + 2) {
                auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar55),auVar7,
                                           auVar94);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x20));
                auVar13 = *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x40);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,auVar13);
                auVar132 = vfmadd213ps_fma(auVar13,auVar7,auVar94);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x60));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x80));
                auVar13 = *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x40);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar93,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,auVar13);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x20));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x60));
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar9,auVar13);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x80));
                auVar13 = *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x40);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,auVar13);
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar11,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar11,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x60));
                auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar12,auVar13);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar12,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x80));
                *pauVar60 = ZEXT1632(auVar102);
                pauVar60[1] = ZEXT1632(auVar132);
                pauVar60 = pauVar60 + 2;
                lVar55 = lVar55 + 0x80;
              }
              for (; iVar56 < iVar36; iVar56 = iVar56 + 1) {
                auVar132 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)piVar71 + lVar55),auVar7,
                                           auVar94);
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar111,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x20));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar8,
                                           *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x40));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar93,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar110,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x20));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar9,
                                           *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x40));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar11,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20));
                auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar12,
                                           *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x40));
                *pauVar60 = ZEXT1632(auVar132);
                pauVar60 = pauVar60 + 1;
                lVar55 = lVar55 + 0x40;
              }
              piVar71 = (pointer)((long)piVar71 + lVar55 + lVar44);
              piVar67 = (pointer)((long)piVar67 + lVar55 + lVar44);
              pvVar69 = (void *)((long)pvVar69 + lVar55 + lVar44);
            }
          }
        }
        else {
          bVar35 = bVar35 >> 2 & bVar35 >> 3 & (auVar26._4_4_ == 5 && auVar26._0_4_ == 5);
          if (((iVar36 == 1 && iVar56 == 1) & bVar35) == 1) {
            uVar57 = 0;
            uVar63 = (ulong)(uint)top_blob->w;
            if (top_blob->w < 1) {
              uVar63 = uVar57;
            }
            pvVar61 = (this->super_ConvolutionDepthWise).bias_data.data;
            uVar41 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar41 = uVar57;
            }
            uVar51 = (ulong)(uint)local_2a8.c;
            if (local_2a8.c < 1) {
              uVar51 = uVar57;
            }
            for (; local_238 = iVar34, uStack_234 = uVar3,
                local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258),
                local_248 = CONCAT44(local_248._4_4_,(uint)local_248), uVar57 != uVar51;
                uVar57 = uVar57 + 1) {
              if (pvVar61 == (void *)0x0) {
                auVar94 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                auVar94 = *(undefined1 (*) [32])((long)pvVar61 + uVar57 * 0x20);
              }
              pvVar45 = (void *)(top_blob->cstep * uVar57 * top_blob->elemsize +
                                (long)top_blob->data);
              pvVar38 = (this->weight_data_tm).data;
              lVar55 = (long)(this->weight_data_tm).w * uVar57 * (this->weight_data_tm).elemsize;
              piVar48 = (pointer)(local_2a8.cstep * uVar57 *
                                  CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize)
                                 + (long)local_2a8.data);
              lVar44 = (long)local_2a8.w *
                       CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
              piVar67 = (pointer)((long)piVar48 + lVar44);
              pvVar69 = (void *)((long)piVar48 + lVar44 * 2);
              pvVar54 = (void *)(lVar44 * 3 + (long)piVar48);
              piVar71 = piVar48 + lVar44;
              for (iVar36 = 0; iVar36 != (int)uVar41; iVar36 = iVar36 + 1) {
                lVar44 = 0;
                uVar39 = uVar63;
                while (iVar50 = (int)uVar39, uVar39 = (ulong)(iVar50 - 1), iVar50 != 0) {
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar55),auVar94,
                                             *(undefined1 (*) [32])((long)piVar48 + lVar44));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x20),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar44 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x40),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar44 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x60),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar44 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x80),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar44 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0xa0),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar44));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0xc0),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar44 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0xe0),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar44 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x100),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar44 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x120),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar44 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x140),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar44));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x160),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar44 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x180),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar44 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x1a0),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar44 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x1c0),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar44 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x1e0),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar54 + lVar44));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x200),
                                             *(undefined1 (*) [32])((long)pvVar54 + lVar44 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x220),
                                             *(undefined1 (*) [32])((long)pvVar54 + lVar44 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x240),
                                             *(undefined1 (*) [32])((long)pvVar54 + lVar44 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x260),
                                             *(undefined1 (*) [32])((long)pvVar54 + lVar44 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x280),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar44));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x2a0),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar44 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x2c0),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar44 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x2e0),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar44 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x300),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar44 + 0x80));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar44) = ZEXT1632(auVar132);
                  lVar44 = lVar44 + 0x20;
                }
                piVar48 = (pointer)((long)piVar48 + lVar44 + 0x80);
                piVar67 = (pointer)((long)piVar67 + lVar44 + 0x80);
                pvVar69 = (void *)((long)pvVar69 + lVar44 + 0x80);
                pvVar54 = (void *)((long)pvVar54 + lVar44 + 0x80);
                piVar71 = (pointer)((long)piVar71 + lVar44 + 0x80);
                pvVar45 = (void *)((long)pvVar45 + lVar44);
              }
            }
          }
          else {
            if ((bVar35 & (iVar36 == 2 && iVar56 == 2)) != 1) {
              uVar66 = auVar26._4_4_ * auVar26._0_4_;
              std::vector<int,_std::allocator<int>_>::vector
                        (&_space_ofs,(long)(int)uVar66,(allocator_type *)&opt_p);
              iVar36 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar56 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar37 = (this->super_ConvolutionDepthWise).dilation_w * iVar56;
              iVar52 = 0;
              lVar44 = 0;
              for (iVar43 = 0; iVar43 < (this->super_ConvolutionDepthWise).kernel_h;
                  iVar43 = iVar43 + 1) {
                for (lVar55 = 0; (int)lVar55 < iVar56; lVar55 = lVar55 + 1) {
                  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)lVar44 + lVar55] = iVar52;
                  iVar52 = iVar52 + (this->super_ConvolutionDepthWise).dilation_w;
                  iVar56 = (this->super_ConvolutionDepthWise).kernel_w;
                }
                iVar52 = iVar52 + (local_238 * iVar36 - iVar37);
                lVar44 = (int)lVar44 + lVar55;
              }
              uVar40 = 0;
              uVar42 = uVar66;
              if ((int)uVar66 < 1) {
                uVar42 = uVar40;
              }
              uVar63 = (ulong)uVar49;
              if ((int)uVar49 < 1) {
                uVar63 = 0;
              }
              for (uVar57 = 0; uVar57 != uVar63; uVar57 = uVar57 + 1) {
                pvVar61 = (void *)(top_blob->cstep * uVar57 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar69 = (this->weight_data_tm).data;
                for (iVar36 = 0; iVar36 <= local_2f8; iVar36 = iVar36 + 1) {
                  for (lVar44 = 0; lVar44 <= iVar50; lVar44 = lVar44 + 1) {
                    if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                      auVar80 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar80 = ZEXT3264(*(undefined1 (*) [32])
                                          ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                          uVar57 * 0x20));
                    }
                    for (lVar55 = 0; (ulong)uVar42 * 4 != lVar55; lVar55 = lVar55 + 4) {
                      auVar132 = vfmadd231ps_fma(auVar80._0_32_,
                                                 *(undefined1 (*) [32])
                                                  ((long)local_2a8.data +
                                                  (long)*(int *)((long)_space_ofs.
                                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar55)
                                                  * 0x20 + (long)((this->super_ConvolutionDepthWise)
                                                                  .stride_w * (int)lVar44 * 8) * 4 +
                                                           (long)iVar36 *
                                                           (long)(this->super_ConvolutionDepthWise).
                                                                 stride_h *
                                                           (long)local_2a8.w *
                                                           CONCAT44(local_2a8.elemsize._4_4_,
                                                                    (undefined4)local_2a8.elemsize)
                                                           + local_2a8.cstep * uVar57 *
                                                             CONCAT44(local_2a8.elemsize._4_4_,
                                                                      (undefined4)local_2a8.elemsize
                                                                     )),
                                                 *(undefined1 (*) [32])
                                                  ((long)pvVar69 +
                                                  lVar55 * 8 + (long)(int)uVar40 * 4));
                      auVar80 = ZEXT1664(auVar132);
                    }
                    *(undefined1 (*) [32])((long)pvVar61 + lVar44 * 0x20) = auVar80._0_32_;
                  }
                  pvVar61 = (void *)((long)pvVar61 + (long)((int)local_258 << 3) * 4);
                }
                uVar40 = uVar40 + uVar66 * 8;
              }
              pLVar21 = this->activation;
              if (pLVar21 != (Layer *)0x0) {
                (*pLVar21->_vptr_Layer[9])(pLVar21,top_blob,opt);
              }
              goto LAB_003ad1a7;
            }
            uVar49 = top_blob->w;
            pvVar61 = (this->super_ConvolutionDepthWise).bias_data.data;
            uVar57 = 0;
            uVar63 = (ulong)uVar49;
            if ((int)uVar49 < 1) {
              uVar63 = uVar57;
            }
            uVar41 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar41 = uVar57;
            }
            uVar51 = (ulong)(uint)local_2a8.c;
            if (local_2a8.c < 1) {
              uVar51 = uVar57;
            }
            lVar44 = (long)(int)((local_2a8.w - uVar49) * 0x10) * 4;
            for (; local_238 = iVar34, uStack_234 = uVar3,
                local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258),
                local_248 = CONCAT44(local_248._4_4_,(uint)local_248), uVar57 != uVar51;
                uVar57 = uVar57 + 1) {
              if (pvVar61 == (void *)0x0) {
                auVar94 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                auVar94 = *(undefined1 (*) [32])((long)pvVar61 + uVar57 * 0x20);
              }
              pauVar60 = (undefined1 (*) [32])
                         (top_blob->cstep * uVar57 * top_blob->elemsize + (long)top_blob->data);
              pvVar38 = (this->weight_data_tm).data;
              lVar53 = (long)(this->weight_data_tm).w * uVar57 * (this->weight_data_tm).elemsize;
              piVar48 = (pointer)(local_2a8.cstep * uVar57 *
                                  CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize)
                                 + (long)local_2a8.data);
              lVar55 = (long)local_2a8.w *
                       CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
              piVar67 = (pointer)((long)piVar48 + lVar55);
              pvVar69 = (void *)((long)piVar48 + lVar55 * 2);
              pvVar45 = (void *)(lVar55 * 3 + (long)piVar48);
              piVar71 = piVar48 + lVar55;
              for (iVar36 = 0; iVar36 != (int)uVar41; iVar36 = iVar36 + 1) {
                lVar55 = 0;
                uVar39 = uVar63;
                while (iVar50 = (int)uVar39, uVar39 = (ulong)(iVar50 - 1), iVar50 != 0) {
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar53),auVar94,
                                             *(undefined1 (*) [32])((long)piVar48 + lVar55));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x20),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar55 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x40),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar55 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x60),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar55 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x80),
                                             *(undefined1 (*) [32])((long)piVar48 + lVar55 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0xa0),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar55));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0xc0),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0xe0),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x100),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x120),
                                             *(undefined1 (*) [32])((long)piVar67 + lVar55 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x140),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar55));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x160),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x180),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x1a0),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x1c0),
                                             *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x1e0),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar45 + lVar55));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x200),
                                             *(undefined1 (*) [32])((long)pvVar45 + lVar55 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x220),
                                             *(undefined1 (*) [32])((long)pvVar45 + lVar55 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x240),
                                             *(undefined1 (*) [32])((long)pvVar45 + lVar55 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x260),
                                             *(undefined1 (*) [32])((long)pvVar45 + lVar55 + 0x80));
                  auVar132 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x280),
                                             ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar55));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x2a0),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x20));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x2c0),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x40));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x2e0),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x60));
                  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),
                                             *(undefined1 (*) [32])((long)pvVar38 + lVar53 + 0x300),
                                             *(undefined1 (*) [32])((long)piVar71 + lVar55 + 0x80));
                  *pauVar60 = ZEXT1632(auVar132);
                  pauVar60 = pauVar60 + 1;
                  lVar55 = lVar55 + 0x40;
                }
                piVar48 = (pointer)((long)piVar48 + lVar55 + lVar44);
                piVar67 = (pointer)((long)piVar67 + lVar55 + lVar44);
                pvVar69 = (void *)((long)pvVar69 + lVar55 + lVar44);
                pvVar45 = (void *)((long)pvVar45 + lVar55 + lVar44);
                piVar71 = (pointer)((long)piVar71 + lVar55 + lVar44);
              }
            }
          }
        }
      }
      goto LAB_003ac98f;
    }
    auVar27._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar27._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar27._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar27._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar132 = vpcmpeqd_avx(auVar27,_DAT_0053a200);
    iVar37 = vmovmskps_avx(auVar132);
    iVar36 = (this->super_ConvolutionDepthWise).stride_w;
    iVar56 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar56 == 1 && (iVar36 == 1 && iVar37 == 0xf)) {
      iVar36 = top_blob->w;
      pvVar61 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar57 = 0;
      uVar63 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar63 = uVar57;
      }
      uVar49 = local_2a8.c;
      if (local_2a8.c < 1) {
        uVar49 = 0;
      }
      while( true ) {
        local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258);
        local_248 = CONCAT44(local_248._4_4_,(uint)local_248);
        if (uVar57 == uVar49) break;
        if (pvVar61 == (void *)0x0) {
          uVar76 = 0;
          uVar81 = 0;
        }
        else {
          puVar1 = (undefined8 *)((long)pvVar61 + uVar57 * 0x10);
          uVar76 = *puVar1;
          uVar81 = puVar1[1];
        }
        pauVar58 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar57 * top_blob->elemsize + (long)top_blob->data);
        pvVar69 = (this->weight_data_tm).data;
        lVar44 = (long)(this->weight_data_tm).w * uVar57 * (this->weight_data_tm).elemsize;
        pauVar70 = (undefined1 (*) [16])
                   (local_2a8.cstep * uVar57 *
                    CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) +
                   (long)local_2a8.data);
        lVar55 = (long)local_2a8.w *
                 CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
        pauVar59 = (undefined1 (*) [16])((long)pvVar69 + lVar44);
        auVar135 = *pauVar59;
        auVar120 = *pauVar59;
        auVar96 = *pauVar59;
        auVar84 = *pauVar59;
        pauVar59 = (undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x10);
        auVar136 = *pauVar59;
        auVar123 = *pauVar59;
        auVar118 = *pauVar59;
        auVar116 = *pauVar59;
        auVar114 = *pauVar59;
        auVar97 = *pauVar59;
        auVar85 = *pauVar59;
        auVar28 = *pauVar59;
        auVar91 = *pauVar59;
        auVar148 = *pauVar59;
        auVar27 = *pauVar59;
        auVar83 = *pauVar59;
        auVar127 = *pauVar59;
        auVar86 = *pauVar59;
        pauVar59 = (undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x20);
        uStack_250 = *(undefined8 *)(*pauVar59 + 8);
        auVar137 = *pauVar59;
        auVar124 = *pauVar59;
        auVar98 = *pauVar59;
        auVar142 = *pauVar59;
        local_258._0_4_ = (int)*(undefined8 *)*pauVar59;
        local_258._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar59 >> 0x20);
        pauVar59 = (undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x30);
        uStack_240 = *(undefined8 *)(*pauVar59 + 8);
        auVar138 = *pauVar59;
        auVar128 = *pauVar59;
        auVar99 = *pauVar59;
        auVar95 = *pauVar59;
        local_248._0_4_ = (uint)*(undefined8 *)*pauVar59;
        local_248._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar59 >> 0x20);
        auVar132 = *(undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x40);
        pauVar59 = (undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x50);
        uStack_210 = *(undefined8 *)(*pauVar59 + 8);
        auVar139 = *pauVar59;
        auVar129 = *pauVar59;
        auVar100 = *pauVar59;
        auVar113 = *pauVar59;
        local_218 = (int)*(undefined8 *)*pauVar59;
        uStack_214 = (undefined4)((ulong)*(undefined8 *)*pauVar59 >> 0x20);
        pauVar59 = (undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x60);
        auVar140 = *pauVar59;
        auVar133 = *pauVar59;
        auVar119 = *pauVar59;
        auVar117 = *pauVar59;
        auVar115 = *pauVar59;
        auVar101 = *pauVar59;
        auVar87 = *pauVar59;
        auVar77 = *pauVar59;
        auVar109 = *pauVar59;
        auVar92 = *pauVar59;
        auVar126 = *pauVar59;
        auVar26 = *pauVar59;
        auVar82 = *pauVar59;
        auVar122 = *pauVar59;
        pauVar59 = (undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x70);
        uStack_230 = *(undefined8 *)(*pauVar59 + 8);
        auVar141 = *pauVar59;
        auVar134 = *pauVar59;
        auVar112 = *pauVar59;
        auVar125 = *pauVar59;
        local_238 = (int)*(undefined8 *)*pauVar59;
        uStack_234 = (undefined4)((ulong)*(undefined8 *)*pauVar59 >> 0x20);
        auVar102 = *(undefined1 (*) [16])((long)pvVar69 + lVar44 + 0x80);
        pauVar59 = (undefined1 (*) [16])(*pauVar70 + lVar55);
        pauVar65 = (undefined1 (*) [16])(*pauVar70 + lVar55 * 2);
        for (iVar50 = 0; iVar50 != (int)uVar63; iVar50 = iVar50 + 1) {
          pauVar72 = pauVar70 + 2;
          pauVar47 = pauVar59 + 2;
          pauVar46 = pauVar65 + 2;
          lVar44 = 0;
          for (iVar56 = 0; iVar56 + 7 < iVar36; iVar56 = iVar56 + 8) {
            auVar29._8_8_ = uVar81;
            auVar29._0_8_ = uVar76;
            auVar143 = vfmadd213ps_fma(*(undefined1 (*) [16])(*pauVar70 + lVar44),auVar84,auVar29);
            auVar4 = *(undefined1 (*) [16])(pauVar70[1] + lVar44);
            auVar5 = *(undefined1 (*) [16])(pauVar70[2] + lVar44);
            auVar6 = *(undefined1 (*) [16])(pauVar70[3] + lVar44);
            auVar143 = vfmadd231ps_fma(auVar143,auVar4,auVar86);
            auVar143 = vfmadd231ps_fma(auVar143,auVar142,auVar5);
            auVar147 = vfmadd231ps_fma(auVar143,auVar95,*(undefined1 (*) [16])(*pauVar59 + lVar44));
            auVar143 = *(undefined1 (*) [16])(pauVar59[1] + lVar44);
            auVar146 = *(undefined1 (*) [16])(pauVar59[2] + lVar44);
            auVar147 = vfmadd231ps_fma(auVar147,auVar132,auVar143);
            auVar147 = vfmadd231ps_fma(auVar147,auVar113,auVar146);
            auVar152 = vfmadd231ps_fma(auVar147,auVar122,*(undefined1 (*) [16])(*pauVar65 + lVar44))
            ;
            auVar147 = *(undefined1 (*) [16])(pauVar59[3] + lVar44);
            auVar149 = *(undefined1 (*) [16])(pauVar65[1] + lVar44);
            auVar150 = *(undefined1 (*) [16])(pauVar65[2] + lVar44);
            auVar30 = *(undefined1 (*) [16])(pauVar65[3] + lVar44);
            auVar152 = vfmadd231ps_fma(auVar152,auVar125,auVar149);
            auVar152 = vfmadd231ps_fma(auVar152,auVar102,auVar150);
            *(undefined1 (*) [16])(*pauVar58 + lVar44) = auVar152;
            auVar4 = vfmadd213ps_fma(auVar4,auVar84,auVar29);
            auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar127);
            auVar4 = vfmadd231ps_fma(auVar4,auVar142,auVar6);
            auVar4 = vfmadd231ps_fma(auVar4,auVar95,auVar143);
            auVar4 = vfmadd231ps_fma(auVar4,auVar146,auVar132);
            auVar4 = vfmadd231ps_fma(auVar4,auVar113,auVar147);
            auVar4 = vfmadd231ps_fma(auVar4,auVar149,auVar82);
            auVar4 = vfmadd231ps_fma(auVar4,auVar125,auVar150);
            auVar149 = vfmadd231ps_fma(auVar4,auVar102,auVar30);
            auVar4 = *(undefined1 (*) [16])(pauVar70[4] + lVar44);
            auVar143 = *(undefined1 (*) [16])(pauVar59[4] + lVar44);
            auVar153 = *(undefined1 (*) [16])(pauVar65[4] + lVar44);
            auVar152 = *(undefined1 (*) [16])(pauVar65[4] + lVar44);
            *(undefined1 (*) [16])(pauVar58[1] + lVar44) = auVar149;
            auVar5 = vfmadd213ps_fma(auVar5,auVar84,auVar29);
            auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar83);
            auVar5 = vfmadd231ps_fma(auVar5,auVar142,auVar4);
            auVar5 = vfmadd231ps_fma(auVar5,auVar95,auVar146);
            auVar5 = vfmadd231ps_fma(auVar5,auVar147,auVar132);
            auVar5 = vfmadd231ps_fma(auVar5,auVar113,auVar143);
            auVar5 = vfmadd231ps_fma(auVar5,auVar150,auVar26);
            auVar5 = vfmadd231ps_fma(auVar5,auVar125,auVar30);
            auVar150 = vfmadd231ps_fma(auVar5,auVar102,auVar152);
            auVar5 = *(undefined1 (*) [16])(pauVar70[5] + lVar44);
            auVar146 = *(undefined1 (*) [16])(pauVar59[5] + lVar44);
            auVar149 = *(undefined1 (*) [16])(pauVar65[5] + lVar44);
            *(undefined1 (*) [16])(pauVar58[2] + lVar44) = auVar150;
            auVar6 = vfmadd213ps_fma(auVar6,auVar84,auVar29);
            auVar6 = vfmadd231ps_fma(auVar6,auVar4,auVar27);
            auVar6 = vfmadd231ps_fma(auVar6,auVar142,auVar5);
            auVar6 = vfmadd231ps_fma(auVar6,auVar95,auVar147);
            auVar6 = vfmadd231ps_fma(auVar6,auVar143,auVar132);
            auVar6 = vfmadd231ps_fma(auVar6,auVar113,auVar146);
            auVar6 = vfmadd231ps_fma(auVar6,auVar30,auVar126);
            auVar6 = vfmadd231ps_fma(auVar6,auVar125,auVar152);
            auVar150 = vfmadd231ps_fma(auVar6,auVar102,auVar149);
            auVar6 = *(undefined1 (*) [16])(pauVar70[6] + lVar44);
            auVar147 = *(undefined1 (*) [16])(pauVar59[6] + lVar44);
            local_228 = *(undefined1 (*) [16])(pauVar65[6] + lVar44);
            *(undefined1 (*) [16])(pauVar58[3] + lVar44) = auVar150;
            auVar4 = vfmadd213ps_fma(auVar4,auVar84,auVar29);
            auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar148);
            auVar4 = vfmadd231ps_fma(auVar4,auVar142,auVar6);
            auVar4 = vfmadd231ps_fma(auVar4,auVar95,auVar143);
            auVar4 = vfmadd231ps_fma(auVar4,auVar146,auVar132);
            auVar4 = vfmadd231ps_fma(auVar4,auVar113,auVar147);
            auVar4 = vfmadd231ps_fma(auVar4,auVar153,auVar92);
            auVar4 = vfmadd231ps_fma(auVar4,auVar125,auVar149);
            auVar152 = vfmadd231ps_fma(auVar4,auVar102,local_228);
            auVar4 = *(undefined1 (*) [16])(pauVar70[7] + lVar44);
            auVar143 = *(undefined1 (*) [16])(pauVar59[7] + lVar44);
            auVar150 = *(undefined1 (*) [16])(pauVar65[7] + lVar44);
            *(undefined1 (*) [16])(pauVar58[4] + lVar44) = auVar152;
            auVar5 = vfmadd213ps_fma(auVar5,auVar84,auVar29);
            auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar91);
            auVar5 = vfmadd231ps_fma(auVar5,auVar142,auVar4);
            auVar5 = vfmadd231ps_fma(auVar5,auVar95,auVar146);
            auVar5 = vfmadd231ps_fma(auVar5,auVar147,auVar132);
            auVar5 = vfmadd231ps_fma(auVar5,auVar113,auVar143);
            auVar5 = vfmadd231ps_fma(auVar5,auVar149,auVar109);
            auVar5 = vfmadd231ps_fma(auVar5,auVar125,local_228);
            auVar152 = vfmadd231ps_fma(auVar5,auVar102,auVar150);
            auVar5 = *(undefined1 (*) [16])(pauVar70[8] + lVar44);
            auVar146 = *(undefined1 (*) [16])(pauVar59[8] + lVar44);
            auVar149 = *(undefined1 (*) [16])(pauVar65[8] + lVar44);
            *(undefined1 (*) [16])(pauVar58[5] + lVar44) = auVar152;
            auVar6 = vfmadd213ps_fma(auVar6,auVar84,auVar29);
            auVar6 = vfmadd231ps_fma(auVar6,auVar4,auVar28);
            auVar6 = vfmadd231ps_fma(auVar6,auVar142,auVar5);
            auVar6 = vfmadd231ps_fma(auVar6,auVar95,auVar147);
            auVar6 = vfmadd231ps_fma(auVar6,auVar132,auVar143);
            auVar6 = vfmadd231ps_fma(auVar6,auVar113,auVar146);
            auVar6 = vfmadd231ps_fma(auVar6,local_228,auVar77);
            auVar4 = vfmadd213ps_fma(auVar4,auVar84,auVar29);
            auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar85);
            auVar4 = vfmadd231ps_fma(auVar4,auVar142,*(undefined1 (*) [16])(pauVar70[9] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar95,auVar143);
            auVar4 = vfmadd231ps_fma(auVar4,auVar132,auVar146);
            auVar5 = vfmadd231ps_fma(auVar6,auVar125,auVar150);
            auVar4 = vfmadd231ps_fma(auVar4,auVar113,*(undefined1 (*) [16])(pauVar59[9] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar150,auVar87);
            auVar4 = vfmadd231ps_fma(auVar4,auVar125,auVar149);
            auVar4 = vfmadd231ps_fma(auVar4,auVar102,*(undefined1 (*) [16])(pauVar65[9] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar102,auVar149);
            *(undefined1 (*) [16])(pauVar58[6] + lVar44) = auVar5;
            *(undefined1 (*) [16])(pauVar58[7] + lVar44) = auVar4;
            lVar44 = lVar44 + 0x80;
            pauVar72 = pauVar72 + 8;
            pauVar47 = pauVar47 + 8;
            pauVar46 = pauVar46 + 8;
          }
          for (; iVar56 + 3 < iVar36; iVar56 = iVar56 + 4) {
            auVar4._8_8_ = uVar81;
            auVar4._0_8_ = uVar76;
            auVar143 = vfmadd213ps_fma(*(undefined1 (*) [16])(*pauVar70 + lVar44),auVar96,auVar4);
            auVar4 = *(undefined1 (*) [16])(pauVar70[1] + lVar44);
            auVar5 = *(undefined1 (*) [16])(pauVar70[2] + lVar44);
            auVar6 = *(undefined1 (*) [16])(pauVar70[3] + lVar44);
            auVar143 = vfmadd231ps_fma(auVar143,auVar4,auVar97);
            auVar143 = vfmadd231ps_fma(auVar143,auVar98,auVar5);
            auVar147 = vfmadd231ps_fma(auVar143,auVar99,*(undefined1 (*) [16])(*pauVar59 + lVar44));
            auVar143 = *(undefined1 (*) [16])(pauVar59[1] + lVar44);
            auVar146 = *(undefined1 (*) [16])(pauVar59[2] + lVar44);
            auVar147 = vfmadd231ps_fma(auVar147,auVar132,auVar143);
            auVar147 = vfmadd231ps_fma(auVar147,auVar100,auVar146);
            auVar152 = vfmadd231ps_fma(auVar147,auVar101,*(undefined1 (*) [16])(*pauVar65 + lVar44))
            ;
            auVar147 = *(undefined1 (*) [16])(pauVar59[3] + lVar44);
            auVar149 = *(undefined1 (*) [16])(pauVar65[1] + lVar44);
            auVar150 = *(undefined1 (*) [16])(pauVar65[2] + lVar44);
            local_228 = *(undefined1 (*) [16])(pauVar65[3] + lVar44);
            auVar152 = vfmadd231ps_fma(auVar152,auVar112,auVar149);
            auVar152 = vfmadd231ps_fma(auVar152,auVar102,auVar150);
            *(undefined1 (*) [16])(*pauVar58 + lVar44) = auVar152;
            auVar30._8_8_ = uVar81;
            auVar30._0_8_ = uVar76;
            auVar4 = vfmadd213ps_fma(auVar4,auVar96,auVar30);
            auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar114);
            auVar4 = vfmadd231ps_fma(auVar4,auVar98,auVar6);
            auVar4 = vfmadd231ps_fma(auVar4,auVar99,auVar143);
            auVar4 = vfmadd231ps_fma(auVar4,auVar146,auVar132);
            auVar4 = vfmadd231ps_fma(auVar4,auVar100,auVar147);
            auVar4 = vfmadd231ps_fma(auVar4,auVar149,auVar115);
            auVar4 = vfmadd231ps_fma(auVar4,auVar112,auVar150);
            auVar152 = vfmadd231ps_fma(auVar4,auVar102,local_228);
            auVar4 = *(undefined1 (*) [16])(pauVar70[4] + lVar44);
            auVar143 = *(undefined1 (*) [16])(pauVar59[4] + lVar44);
            auVar149 = *(undefined1 (*) [16])(pauVar65[4] + lVar44);
            *(undefined1 (*) [16])(pauVar58[1] + lVar44) = auVar152;
            auVar5 = vfmadd213ps_fma(auVar5,auVar96,auVar30);
            auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar116);
            auVar5 = vfmadd231ps_fma(auVar5,auVar98,auVar4);
            auVar5 = vfmadd231ps_fma(auVar5,auVar99,auVar146);
            auVar5 = vfmadd231ps_fma(auVar5,auVar147,auVar132);
            auVar5 = vfmadd231ps_fma(auVar5,auVar100,auVar143);
            auVar146 = vfmadd231ps_fma(auVar5,auVar150,auVar117);
            auVar5 = vfmadd213ps_fma(auVar6,auVar96,auVar30);
            auVar4 = vfmadd231ps_fma(auVar5,auVar4,auVar118);
            auVar4 = vfmadd231ps_fma(auVar4,auVar98,*(undefined1 (*) [16])(pauVar70[5] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar99,auVar147);
            auVar4 = vfmadd231ps_fma(auVar4,auVar143,auVar132);
            auVar5 = vfmadd231ps_fma(auVar146,auVar112,local_228);
            auVar4 = vfmadd231ps_fma(auVar4,auVar100,*(undefined1 (*) [16])(pauVar59[5] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,local_228,auVar119);
            auVar4 = vfmadd231ps_fma(auVar4,auVar112,auVar149);
            auVar4 = vfmadd231ps_fma(auVar4,auVar102,*(undefined1 (*) [16])(pauVar65[5] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar102,auVar149);
            *(undefined1 (*) [16])(pauVar58[2] + lVar44) = auVar5;
            *(undefined1 (*) [16])(pauVar58[3] + lVar44) = auVar4;
            lVar44 = lVar44 + 0x40;
            pauVar72 = pauVar72 + 4;
            pauVar47 = pauVar47 + 4;
            pauVar46 = pauVar46 + 4;
          }
          for (; iVar56 + 1 < iVar36; iVar56 = iVar56 + 2) {
            auVar6._8_8_ = uVar81;
            auVar6._0_8_ = uVar76;
            auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])(*pauVar70 + lVar44),auVar120,auVar6);
            auVar4 = vfmadd231ps_fma(auVar4,auVar123,*(undefined1 (*) [16])(pauVar70[1] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar4,auVar124,*(undefined1 (*) [16])(pauVar70[2] + lVar44));
            auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])(pauVar70[1] + lVar44),auVar120,auVar6);
            auVar4 = vfmadd231ps_fma(auVar4,auVar123,*(undefined1 (*) [16])(pauVar70[2] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar128,*(undefined1 (*) [16])(*pauVar59 + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar124,*(undefined1 (*) [16])(pauVar70[3] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar132,*(undefined1 (*) [16])(pauVar59[1] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar128,*(undefined1 (*) [16])(pauVar59[1] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar129,*(undefined1 (*) [16])(pauVar59[2] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar132,*(undefined1 (*) [16])(pauVar59[2] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar133,*(undefined1 (*) [16])(*pauVar65 + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar134,*(undefined1 (*) [16])(pauVar65[1] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar129,*(undefined1 (*) [16])(pauVar59[3] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar133,*(undefined1 (*) [16])(pauVar65[1] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar134,*(undefined1 (*) [16])(pauVar65[2] + lVar44));
            auVar4 = vfmadd231ps_fma(auVar4,auVar102,*(undefined1 (*) [16])(pauVar65[3] + lVar44));
            auVar5 = vfmadd231ps_fma(auVar5,auVar102,*(undefined1 (*) [16])(pauVar65[2] + lVar44));
            *(undefined1 (*) [16])(*pauVar58 + lVar44) = auVar5;
            *(undefined1 (*) [16])(pauVar58[1] + lVar44) = auVar4;
            lVar44 = lVar44 + 0x20;
            pauVar72 = pauVar72 + 2;
            pauVar47 = pauVar47 + 2;
            pauVar46 = pauVar46 + 2;
          }
          pauVar58 = (undefined1 (*) [16])(*pauVar58 + lVar44);
          pauVar70 = pauVar72;
          for (; iVar56 < iVar36; iVar56 = iVar56 + 1) {
            auVar5._8_8_ = uVar81;
            auVar5._0_8_ = uVar76;
            auVar4 = vfmadd213ps_fma(pauVar70[-2],auVar135,auVar5);
            auVar4 = vfmadd231ps_fma(auVar4,auVar136,pauVar70[-1]);
            auVar4 = vfmadd231ps_fma(auVar4,auVar137,*pauVar70);
            auVar4 = vfmadd231ps_fma(auVar4,auVar138,pauVar47[-2]);
            auVar4 = vfmadd231ps_fma(auVar4,auVar132,pauVar47[-1]);
            auVar4 = vfmadd231ps_fma(auVar4,auVar139,*pauVar47);
            auVar4 = vfmadd231ps_fma(auVar4,auVar140,pauVar46[-2]);
            auVar4 = vfmadd231ps_fma(auVar4,auVar141,pauVar46[-1]);
            auVar4 = vfmadd231ps_fma(auVar4,auVar102,*pauVar46);
            *pauVar58 = auVar4;
            pauVar58 = pauVar58 + 1;
            pauVar70 = pauVar70 + 1;
            pauVar47 = pauVar47 + 1;
            pauVar46 = pauVar46 + 1;
          }
          pauVar59 = pauVar47;
          pauVar65 = pauVar46;
        }
        uVar57 = uVar57 + 1;
      }
      goto LAB_003ac98f;
    }
    bVar35 = (byte)iVar37;
    if ((iVar56 == 2 && iVar36 == 2) && bVar35 == 0xf) {
      iVar36 = top_blob->w;
      pvVar61 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar57 = 0;
      uVar63 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar63 = uVar57;
      }
      uVar41 = (ulong)(uint)local_2a8.c;
      if (local_2a8.c < 1) {
        uVar41 = uVar57;
      }
      lVar44 = (long)((local_2a8.w - iVar36) * 8) * 4;
      for (; local_238 = iVar34, uStack_234 = uVar3,
          local_258 = (void *)CONCAT44(local_258._4_4_,(int)local_258),
          local_248 = CONCAT44(local_248._4_4_,(uint)local_248), uVar57 != uVar41;
          uVar57 = uVar57 + 1) {
        if (pvVar61 == (void *)0x0) {
          auVar132 = (undefined1  [16])0x0;
        }
        else {
          auVar132 = *(undefined1 (*) [16])((long)pvVar61 + uVar57 * 0x10);
        }
        pauVar59 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar57 * top_blob->elemsize + (long)top_blob->data);
        pvVar38 = (this->weight_data_tm).data;
        lVar53 = (long)(this->weight_data_tm).w * uVar57 * (this->weight_data_tm).elemsize;
        piVar71 = (pointer)(local_2a8.cstep * uVar57 *
                            CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) +
                           (long)local_2a8.data);
        lVar55 = (long)local_2a8.w *
                 CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
        piVar67 = (pointer)((long)piVar71 + lVar55);
        pvVar69 = (void *)((long)piVar71 + lVar55 * 2);
        auVar102 = *(undefined1 (*) [16])((long)pvVar38 + lVar53);
        auVar84 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x10);
        auVar86 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x20);
        auVar142 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x30);
        auVar95 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x40);
        auVar113 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x50);
        auVar122 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x60);
        auVar125 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x70);
        auVar127 = *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x80);
        for (iVar50 = 0; iVar50 != (int)uVar63; iVar50 = iVar50 + 1) {
          lVar55 = 0;
          for (iVar56 = 0; iVar56 + 3 < iVar36; iVar56 = iVar56 + 4) {
            auVar82 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)piVar71 + lVar55),auVar102,
                                      auVar132);
            auVar83 = vfmadd231ps_fma(auVar82,auVar84,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x10));
            auVar82 = *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x20);
            auVar83 = vfmadd231ps_fma(auVar83,auVar86,auVar82);
            auVar83 = vfmadd231ps_fma(auVar83,auVar142,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55));
            auVar26 = vfmadd231ps_fma(auVar83,auVar95,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x10));
            auVar83 = *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x20);
            auVar26 = vfmadd231ps_fma(auVar26,auVar113,auVar83);
            auVar26 = vfmadd231ps_fma(auVar26,auVar122,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55));
            auVar27 = vfmadd231ps_fma(auVar26,auVar125,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x10));
            auVar26 = *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x40);
            auVar82 = vfmadd213ps_fma(auVar82,auVar102,auVar132);
            auVar126 = vfmadd231ps_fma(auVar82,auVar84,
                                       *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x30));
            auVar82 = *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x40);
            auVar126 = vfmadd231ps_fma(auVar126,auVar86,auVar26);
            auVar126 = vfmadd231ps_fma(auVar126,auVar142,auVar83);
            auVar83 = *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x20);
            auVar27 = vfmadd231ps_fma(auVar27,auVar127,auVar83);
            auVar126 = vfmadd231ps_fma(auVar126,auVar95,
                                       *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x30));
            auVar126 = vfmadd231ps_fma(auVar126,auVar113,auVar82);
            auVar126 = vfmadd231ps_fma(auVar126,auVar122,auVar83);
            auVar83 = *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x40);
            auVar126 = vfmadd231ps_fma(auVar126,auVar125,
                                       *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x30));
            *pauVar59 = auVar27;
            auVar126 = vfmadd231ps_fma(auVar126,auVar127,auVar83);
            auVar27 = *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x60);
            auVar26 = vfmadd213ps_fma(auVar26,auVar102,auVar132);
            auVar26 = vfmadd231ps_fma(auVar26,auVar84,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x50));
            auVar26 = vfmadd231ps_fma(auVar26,auVar86,auVar27);
            auVar26 = vfmadd231ps_fma(auVar26,auVar142,auVar82);
            auVar82 = *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x60);
            auVar26 = vfmadd231ps_fma(auVar26,auVar95,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x50));
            auVar26 = vfmadd231ps_fma(auVar26,auVar113,auVar82);
            auVar26 = vfmadd231ps_fma(auVar26,auVar122,auVar83);
            auVar83 = *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x60);
            auVar148 = vfmadd231ps_fma(auVar26,auVar125,
                                       *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x50));
            pauVar59[1] = auVar126;
            auVar26 = vfmadd213ps_fma(auVar27,auVar102,auVar132);
            auVar26 = vfmadd231ps_fma(auVar26,auVar84,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x70));
            auVar26 = vfmadd231ps_fma(auVar26,auVar86,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x80));
            auVar82 = vfmadd231ps_fma(auVar26,auVar142,auVar82);
            auVar82 = vfmadd231ps_fma(auVar82,auVar95,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x70));
            auVar82 = vfmadd231ps_fma(auVar82,auVar113,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x80));
            auVar82 = vfmadd231ps_fma(auVar82,auVar122,auVar83);
            auVar82 = vfmadd231ps_fma(auVar82,auVar125,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x70));
            auVar83 = vfmadd231ps_fma(auVar148,auVar127,auVar83);
            auVar82 = vfmadd231ps_fma(auVar82,auVar127,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x80));
            pauVar59[2] = auVar83;
            pauVar59[3] = auVar82;
            pauVar59 = pauVar59 + 4;
            lVar55 = lVar55 + 0x80;
          }
          for (; iVar56 + 1 < iVar36; iVar56 = iVar56 + 2) {
            auVar82 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)piVar71 + lVar55),auVar102,
                                      auVar132);
            auVar83 = vfmadd231ps_fma(auVar82,auVar84,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x10));
            auVar82 = *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x20);
            auVar83 = vfmadd231ps_fma(auVar83,auVar86,auVar82);
            auVar26 = vfmadd231ps_fma(auVar83,auVar142,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55));
            auVar83 = *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x20);
            auVar26 = vfmadd231ps_fma(auVar26,auVar95,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x10));
            auVar26 = vfmadd231ps_fma(auVar26,auVar113,auVar83);
            auVar26 = vfmadd231ps_fma(auVar26,auVar122,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55));
            auVar26 = vfmadd231ps_fma(auVar26,auVar125,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x10));
            auVar82 = vfmadd213ps_fma(auVar82,auVar102,auVar132);
            auVar82 = vfmadd231ps_fma(auVar82,auVar84,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x30));
            auVar82 = vfmadd231ps_fma(auVar82,auVar86,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x40));
            auVar82 = vfmadd231ps_fma(auVar82,auVar142,auVar83);
            auVar82 = vfmadd231ps_fma(auVar82,auVar95,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x30));
            auVar83 = vfmadd231ps_fma(auVar82,auVar113,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x40));
            auVar82 = *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x20);
            auVar83 = vfmadd231ps_fma(auVar83,auVar122,auVar82);
            auVar83 = vfmadd231ps_fma(auVar83,auVar125,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x30));
            auVar82 = vfmadd231ps_fma(auVar26,auVar127,auVar82);
            auVar83 = vfmadd231ps_fma(auVar83,auVar127,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x40));
            *pauVar59 = auVar82;
            pauVar59[1] = auVar83;
            pauVar59 = pauVar59 + 2;
            lVar55 = lVar55 + 0x40;
          }
          for (; iVar56 < iVar36; iVar56 = iVar56 + 1) {
            auVar82 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)piVar71 + lVar55),auVar102,
                                      auVar132);
            auVar82 = vfmadd231ps_fma(auVar82,auVar84,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x10));
            auVar82 = vfmadd231ps_fma(auVar82,auVar86,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x20));
            auVar82 = vfmadd231ps_fma(auVar82,auVar142,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55));
            auVar82 = vfmadd231ps_fma(auVar82,auVar95,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x10));
            auVar82 = vfmadd231ps_fma(auVar82,auVar113,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x20));
            auVar82 = vfmadd231ps_fma(auVar82,auVar122,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55));
            auVar82 = vfmadd231ps_fma(auVar82,auVar125,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x10));
            auVar82 = vfmadd231ps_fma(auVar82,auVar127,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x20));
            *pauVar59 = auVar82;
            pauVar59 = pauVar59 + 1;
            lVar55 = lVar55 + 0x20;
          }
          piVar71 = (pointer)((long)piVar71 + lVar55 + lVar44);
          piVar67 = (pointer)((long)piVar67 + lVar55 + lVar44);
          pvVar69 = (void *)((long)pvVar69 + lVar55 + lVar44);
        }
      }
      goto LAB_003ac98f;
    }
    bVar35 = bVar35 >> 2 & bVar35 >> 3 & (auVar27._4_4_ == 5 && auVar27._0_4_ == 5);
    if (((iVar36 == 1 && iVar56 == 1) & bVar35) == 1) {
      uVar49 = top_blob->w;
      iVar36 = top_blob->h;
      local_258 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar63 = 0;
      uVar66 = uVar49;
      if ((int)uVar49 < 1) {
        uVar66 = 0;
      }
      uVar42 = local_2a8.c;
      if (local_2a8.c < 1) {
        uVar42 = 0;
      }
      lVar44 = (long)(int)(uVar49 * 4) * 4;
      lVar55 = (long)(local_2a8.w * 4 + 0x10) * 4;
      for (; local_238 = iVar34, uStack_234 = uVar3,
          local_248 = CONCAT44(local_248._4_4_,(uint)local_248), uVar63 != uVar42;
          uVar63 = uVar63 + 1) {
        if (local_258 == (void *)0x0) {
          auVar132 = (undefined1  [16])0x0;
        }
        else {
          auVar132 = *(undefined1 (*) [16])((long)local_258 + uVar63 * 0x10);
        }
        pvVar62 = (void *)(top_blob->cstep * uVar63 * top_blob->elemsize + (long)top_blob->data);
        pvVar69 = (this->weight_data_tm).data;
        lVar64 = (long)(this->weight_data_tm).w * uVar63 * (this->weight_data_tm).elemsize;
        pvVar54 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar62);
        piVar48 = (pointer)(local_2a8.cstep * uVar63 *
                            CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) +
                           (long)local_2a8.data);
        lVar53 = (long)local_2a8.w *
                 CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
        piVar67 = (pointer)((long)piVar48 + lVar53);
        pvVar61 = (void *)((long)piVar48 + lVar53 * 2);
        pvVar45 = (void *)(lVar53 * 3 + (long)piVar48);
        piVar71 = piVar48 + lVar53;
        pvVar38 = (void *)(lVar53 * 5 + (long)piVar48);
        for (uVar49 = 0; (int)(uVar49 | 1) < iVar36; uVar49 = uVar49 + 2) {
          lVar53 = 0;
          uVar40 = uVar66;
          while (bVar74 = uVar40 != 0, uVar40 = uVar40 - 1, bVar74) {
            auVar102 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x10);
            auVar84 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x20);
            auVar86 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x30);
            auVar142 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)piVar48 + lVar53),
                                       *(undefined1 (*) [16])((long)pvVar69 + lVar64),auVar132);
            auVar142 = vfmadd231ps_fma(auVar142,auVar102,
                                       *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x10));
            auVar142 = vfmadd231ps_fma(auVar142,auVar84,
                                       *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x20));
            auVar95 = vfmadd231ps_fma(auVar142,auVar86,
                                      *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x30));
            auVar142 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x40);
            auVar82 = vfmadd231ps_fma(auVar95,auVar142,
                                      *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x40));
            auVar95 = *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x10);
            auVar113 = *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x20);
            auVar122 = *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x30);
            auVar125 = *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x40);
            auVar127 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar69 + lVar64),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar53),auVar132);
            auVar102 = vfmadd231ps_fma(auVar127,auVar95,auVar102);
            auVar102 = vfmadd231ps_fma(auVar102,auVar113,auVar84);
            auVar102 = vfmadd231ps_fma(auVar102,auVar122,auVar86);
            auVar83 = vfmadd231ps_fma(auVar102,auVar125,auVar142);
            auVar102 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x50);
            auVar84 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x60);
            auVar86 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x70);
            auVar142 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x80);
            auVar127 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x90);
            auVar82 = vfmadd231ps_fma(auVar82,auVar102,
                                      *(undefined1 (*) [16])((long)piVar67 + lVar53));
            auVar95 = vfmadd231ps_fma(auVar82,auVar84,auVar95);
            auVar95 = vfmadd231ps_fma(auVar95,auVar86,auVar113);
            auVar95 = vfmadd231ps_fma(auVar95,auVar142,auVar122);
            auVar82 = vfmadd231ps_fma(auVar95,auVar127,auVar125);
            auVar95 = *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x10);
            auVar113 = *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x20);
            auVar122 = *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x30);
            auVar125 = *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x40);
            auVar102 = vfmadd231ps_fma(auVar83,*(undefined1 (*) [16])((long)pvVar61 + lVar53),
                                       auVar102);
            auVar102 = vfmadd231ps_fma(auVar102,auVar95,auVar84);
            auVar102 = vfmadd231ps_fma(auVar102,auVar113,auVar86);
            auVar102 = vfmadd231ps_fma(auVar102,auVar122,auVar142);
            auVar83 = vfmadd231ps_fma(auVar102,auVar125,auVar127);
            auVar102 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xa0);
            auVar84 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xb0);
            auVar86 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xc0);
            auVar142 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xd0);
            auVar127 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xe0);
            auVar82 = vfmadd231ps_fma(auVar82,auVar102,
                                      *(undefined1 (*) [16])((long)pvVar61 + lVar53));
            auVar95 = vfmadd231ps_fma(auVar82,auVar84,auVar95);
            auVar95 = vfmadd231ps_fma(auVar95,auVar86,auVar113);
            auVar95 = vfmadd231ps_fma(auVar95,auVar142,auVar122);
            auVar82 = vfmadd231ps_fma(auVar95,auVar127,auVar125);
            auVar95 = *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x10);
            auVar113 = *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x20);
            auVar122 = *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x30);
            auVar125 = *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x40);
            auVar102 = vfmadd231ps_fma(auVar83,*(undefined1 (*) [16])((long)pvVar45 + lVar53),
                                       auVar102);
            auVar102 = vfmadd231ps_fma(auVar102,auVar95,auVar84);
            auVar102 = vfmadd231ps_fma(auVar102,auVar113,auVar86);
            auVar102 = vfmadd231ps_fma(auVar102,auVar122,auVar142);
            auVar83 = vfmadd231ps_fma(auVar102,auVar125,auVar127);
            auVar102 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xf0);
            auVar84 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x100);
            auVar86 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x110);
            auVar142 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x120);
            auVar127 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x130);
            auVar82 = vfmadd231ps_fma(auVar82,auVar102,
                                      *(undefined1 (*) [16])((long)pvVar45 + lVar53));
            auVar95 = vfmadd231ps_fma(auVar82,auVar84,auVar95);
            auVar95 = vfmadd231ps_fma(auVar95,auVar86,auVar113);
            auVar95 = vfmadd231ps_fma(auVar95,auVar142,auVar122);
            auVar82 = vfmadd231ps_fma(auVar95,auVar127,auVar125);
            auVar95 = *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x10);
            auVar113 = *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x20);
            auVar122 = *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x30);
            auVar125 = *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x40);
            auVar102 = vfmadd231ps_fma(auVar83,*(undefined1 (*) [16])((long)piVar71 + lVar53),
                                       auVar102);
            auVar102 = vfmadd231ps_fma(auVar102,auVar95,auVar84);
            auVar102 = vfmadd231ps_fma(auVar102,auVar113,auVar86);
            auVar102 = vfmadd231ps_fma(auVar102,auVar122,auVar142);
            auVar83 = vfmadd231ps_fma(auVar102,auVar125,auVar127);
            auVar102 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x140);
            auVar84 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x150);
            auVar86 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x160);
            auVar142 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x170);
            auVar127 = *(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x180);
            auVar82 = vfmadd231ps_fma(auVar82,auVar102,
                                      *(undefined1 (*) [16])((long)piVar71 + lVar53));
            auVar95 = vfmadd231ps_fma(auVar82,auVar84,auVar95);
            auVar95 = vfmadd231ps_fma(auVar95,auVar86,auVar113);
            auVar95 = vfmadd231ps_fma(auVar95,auVar142,auVar122);
            auVar102 = vfmadd231ps_fma(auVar83,auVar102,
                                       *(undefined1 (*) [16])((long)pvVar38 + lVar53));
            auVar102 = vfmadd231ps_fma(auVar102,auVar84,
                                       *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,auVar86,
                                       *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,auVar142,
                                       *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,auVar127,
                                       *(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x40));
            auVar84 = vfmadd231ps_fma(auVar95,auVar127,auVar125);
            *(undefined1 (*) [16])((long)pvVar62 + lVar53) = auVar84;
            *(undefined1 (*) [16])((long)pvVar54 + lVar53) = auVar102;
            lVar53 = lVar53 + 0x10;
          }
          piVar48 = (pointer)((long)piVar48 + lVar53 + lVar55);
          piVar67 = (pointer)((long)piVar67 + lVar53 + lVar55);
          pvVar61 = (void *)((long)pvVar61 + lVar53 + lVar55);
          pvVar45 = (void *)((long)pvVar45 + lVar53 + lVar55);
          piVar71 = (pointer)((long)piVar71 + lVar53 + lVar55);
          pvVar38 = (void *)((long)pvVar38 + lVar53 + lVar55);
          pvVar62 = (void *)((long)pvVar62 + lVar53 + lVar44);
          pvVar54 = (void *)((long)pvVar54 + lVar53 + lVar44);
        }
        for (; (int)uVar49 < iVar36; uVar49 = uVar49 + 1) {
          lVar53 = 0;
          uVar40 = uVar66;
          while (bVar74 = uVar40 != 0, uVar40 = uVar40 - 1, bVar74) {
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar69 + lVar64),auVar132,
                                       *(undefined1 (*) [16])((long)piVar48 + lVar53));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x10),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x20),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x30),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x40),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar53 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x50),
                                       auVar102,*(undefined1 (*) [16])((long)piVar67 + lVar53));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x60),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x70),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x80),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x90),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar53 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xa0),
                                       auVar102,*(undefined1 (*) [16])((long)pvVar61 + lVar53));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0xb0),
                                       *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0xc0),
                                       *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0xd0),
                                       *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0xe0),
                                       *(undefined1 (*) [16])((long)pvVar61 + lVar53 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0xf0),
                                       auVar102,*(undefined1 (*) [16])((long)pvVar45 + lVar53));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x100),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x110),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x120),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x130),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar53 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar69 + lVar64 + 0x140),
                                       auVar102,*(undefined1 (*) [16])((long)piVar71 + lVar53));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x150),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x160),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x170),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar64 + 0x180),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar53 + 0x40));
            *(undefined1 (*) [16])((long)pvVar62 + lVar53) = auVar102;
            lVar53 = lVar53 + 0x10;
          }
          piVar48 = (pointer)((long)piVar48 + lVar53 + 0x40);
          piVar67 = (pointer)((long)piVar67 + lVar53 + 0x40);
          pvVar61 = (void *)((long)pvVar61 + lVar53 + 0x40);
          pvVar45 = (void *)((long)pvVar45 + lVar53 + 0x40);
          piVar71 = (pointer)((long)piVar71 + lVar53 + 0x40);
          pvVar62 = (void *)((long)pvVar62 + lVar53);
        }
      }
      goto LAB_003ac98f;
    }
    if ((bVar35 & (iVar36 == 2 && iVar56 == 2)) == 1) {
      uVar49 = top_blob->w;
      pvVar61 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar57 = 0;
      uVar63 = (ulong)uVar49;
      if ((int)uVar49 < 1) {
        uVar63 = uVar57;
      }
      uVar41 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar41 = uVar57;
      }
      uVar51 = (ulong)(uint)local_2a8.c;
      if (local_2a8.c < 1) {
        uVar51 = uVar57;
      }
      lVar44 = (long)(int)((local_2a8.w - uVar49) * 8) * 4;
      for (; local_238 = iVar34, uStack_234 = uVar3, uVar57 != uVar51; uVar57 = uVar57 + 1) {
        if (pvVar61 == (void *)0x0) {
          auVar132 = (undefined1  [16])0x0;
        }
        else {
          auVar132 = *(undefined1 (*) [16])((long)pvVar61 + uVar57 * 0x10);
        }
        pauVar59 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar57 * top_blob->elemsize + (long)top_blob->data);
        pvVar38 = (this->weight_data_tm).data;
        lVar53 = (long)(this->weight_data_tm).w * uVar57 * (this->weight_data_tm).elemsize;
        piVar48 = (pointer)(local_2a8.cstep * uVar57 *
                            CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) +
                           (long)local_2a8.data);
        lVar55 = (long)local_2a8.w *
                 CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
        piVar67 = (pointer)((long)piVar48 + lVar55);
        pvVar69 = (void *)((long)piVar48 + lVar55 * 2);
        pvVar45 = (void *)(lVar55 * 3 + (long)piVar48);
        piVar71 = piVar48 + lVar55;
        for (iVar36 = 0; iVar36 != (int)uVar41; iVar36 = iVar36 + 1) {
          lVar55 = 0;
          uVar39 = uVar63;
          while (iVar50 = (int)uVar39, uVar39 = (ulong)(iVar50 - 1), iVar50 != 0) {
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar38 + lVar53),auVar132,
                                       *(undefined1 (*) [16])((long)piVar48 + lVar55));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x10),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar55 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x20),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar55 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x30),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar55 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x40),
                                       *(undefined1 (*) [16])((long)piVar48 + lVar55 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x50),
                                       auVar102,*(undefined1 (*) [16])((long)piVar67 + lVar55));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x60),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x70),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x80),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x90),
                                       *(undefined1 (*) [16])((long)piVar67 + lVar55 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0xa0),
                                       auVar102,*(undefined1 (*) [16])((long)pvVar69 + lVar55));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0xb0),
                                       *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0xc0),
                                       *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0xd0),
                                       *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0xe0),
                                       *(undefined1 (*) [16])((long)pvVar69 + lVar55 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0xf0),
                                       auVar102,*(undefined1 (*) [16])((long)pvVar45 + lVar55));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x100),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar55 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x110),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar55 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x120),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar55 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x130),
                                       *(undefined1 (*) [16])((long)pvVar45 + lVar55 + 0x40));
            auVar102 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar38 + lVar53 + 0x140),
                                       auVar102,*(undefined1 (*) [16])((long)piVar71 + lVar55));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x150),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x10));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x160),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x20));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x170),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x30));
            auVar102 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])
                                                 ((long)pvVar38 + lVar53 + 0x180),
                                       *(undefined1 (*) [16])((long)piVar71 + lVar55 + 0x40));
            *pauVar59 = auVar102;
            pauVar59 = pauVar59 + 1;
            lVar55 = lVar55 + 0x20;
          }
          piVar48 = (pointer)((long)piVar48 + lVar55 + lVar44);
          piVar67 = (pointer)((long)piVar67 + lVar55 + lVar44);
          pvVar69 = (void *)((long)pvVar69 + lVar55 + lVar44);
          pvVar45 = (void *)((long)pvVar45 + lVar55 + lVar44);
          piVar71 = (pointer)((long)piVar71 + lVar55 + lVar44);
        }
      }
      goto LAB_003ac98f;
    }
    uVar66 = auVar27._4_4_ * auVar27._0_4_;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(long)(int)uVar66,(allocator_type *)&opt_p);
    iVar36 = (this->super_ConvolutionDepthWise).dilation_h;
    iVar56 = (this->super_ConvolutionDepthWise).kernel_w;
    iVar37 = (this->super_ConvolutionDepthWise).dilation_w * iVar56;
    lVar44 = 0;
    iVar43 = 0;
    for (iVar52 = 0; iVar52 < (this->super_ConvolutionDepthWise).kernel_h; iVar52 = iVar52 + 1) {
      for (lVar55 = 0; (int)lVar55 < iVar56; lVar55 = lVar55 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar44 + lVar55] = iVar43;
        iVar43 = iVar43 + (this->super_ConvolutionDepthWise).dilation_w;
        iVar56 = (this->super_ConvolutionDepthWise).kernel_w;
      }
      iVar43 = iVar43 + (local_238 * iVar36 - iVar37);
      lVar44 = (int)lVar44 + lVar55;
    }
    local_248._0_4_ = uVar66 * 4;
    uVar57 = 0;
    uVar63 = (ulong)uVar66;
    if ((int)uVar66 < 1) {
      uVar63 = uVar57;
    }
    uVar41 = (ulong)uVar49;
    if ((int)uVar49 < 1) {
      uVar41 = uVar57;
    }
    auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar80 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
    auVar121 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar148._8_4_ = 0xc2b0c0a5;
    auVar148._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar148._12_4_ = 0xc2b0c0a5;
    auVar126._8_4_ = 0xb95e8083;
    auVar126._0_8_ = 0xb95e8083b95e8083;
    auVar126._12_4_ = 0xb95e8083;
    for (uVar51 = 0; uVar51 != uVar41; uVar51 = uVar51 + 1) {
      pvVar61 = (void *)(top_blob->cstep * uVar51 * top_blob->elemsize + (long)top_blob->data);
      pvVar69 = (this->weight_data_tm).data;
      for (iVar36 = 0; iVar36 <= local_2f8; iVar36 = iVar36 + 1) {
        for (lVar44 = 0; lVar44 <= iVar50; lVar44 = lVar44 + 1) {
          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
            auVar132 = ZEXT816(0) << 0x40;
          }
          else {
            auVar132 = *(undefined1 (*) [16])
                        ((long)(this->super_ConvolutionDepthWise).bias_data.data + uVar51 * 0x10);
          }
          for (lVar55 = 0; uVar63 * 4 != lVar55; lVar55 = lVar55 + 4) {
            auVar132 = vfmadd231ps_fma(auVar132,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar55 * 4 + (long)(int)uVar57 * 4
                                                 ),
                                       *(undefined1 (*) [16])
                                        ((long)local_2a8.data +
                                        (long)*(int *)((long)_space_ofs.
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar55)
                                        * 0x10 + (long)((this->super_ConvolutionDepthWise).stride_w
                                                        * (int)lVar44 * 4) * 4 +
                                                 (long)iVar36 *
                                                 (long)(this->super_ConvolutionDepthWise).stride_h *
                                                 (long)local_2a8.w *
                                                 CONCAT44(local_2a8.elemsize._4_4_,
                                                          (undefined4)local_2a8.elemsize) +
                                                 local_2a8.cstep * uVar51 *
                                                 CONCAT44(local_2a8.elemsize._4_4_,
                                                          (undefined4)local_2a8.elemsize)));
          }
          iVar56 = (this->super_ConvolutionDepthWise).activation_type;
          auVar92 = auVar132;
          if (iVar56 - 1U < 6) {
            auVar86 = auVar145._0_16_;
            auVar92 = vmaxps_avx(auVar132,auVar86);
            auVar84 = auVar121._0_16_;
            auVar102 = auVar80._0_16_;
            fVar75 = auVar121._0_4_;
            fVar23 = auVar121._4_4_;
            fVar24 = auVar121._8_4_;
            fVar25 = auVar121._12_4_;
            switch(iVar56) {
            case 2:
              auVar132 = vminps_avx(auVar132,auVar86);
              uVar3 = *(this->super_ConvolutionDepthWise).activation_params.data;
              auVar151._4_4_ = uVar3;
              auVar151._0_4_ = uVar3;
              auVar151._8_4_ = uVar3;
              auVar151._12_4_ = uVar3;
              auVar92 = vfmadd231ps_fma(auVar92,auVar132,auVar151);
              break;
            case 3:
              puVar22 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
              uVar3 = *puVar22;
              auVar88._4_4_ = uVar3;
              auVar88._0_4_ = uVar3;
              auVar88._8_4_ = uVar3;
              auVar88._12_4_ = uVar3;
              uVar3 = puVar22[1];
              auVar155._4_4_ = uVar3;
              auVar155._0_4_ = uVar3;
              auVar155._8_4_ = uVar3;
              auVar155._12_4_ = uVar3;
              auVar132 = vmaxps_avx(auVar132,auVar88);
              auVar92 = vminps_avx(auVar155,auVar132);
              break;
            case 4:
              auVar89._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
              auVar89._8_4_ = -auVar132._8_4_;
              auVar89._12_4_ = -auVar132._12_4_;
              auVar103._8_4_ = 0x42b0c0a5;
              auVar103._0_8_ = 0x42b0c0a542b0c0a5;
              auVar103._12_4_ = 0x42b0c0a5;
              auVar132 = vminps_avx(auVar89,auVar103);
              auVar104._8_4_ = 0xc2b0c0a5;
              auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar104._12_4_ = 0xc2b0c0a5;
              auVar142 = vmaxps_avx(auVar132,auVar104);
              auVar130._8_4_ = 0x3fb8aa3b;
              auVar130._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar130._12_4_ = 0x3fb8aa3b;
              auVar132 = vfmadd213ps_fma(auVar130,auVar142,auVar102);
              auVar156._0_4_ = (int)auVar132._0_4_;
              auVar156._4_4_ = (int)auVar132._4_4_;
              auVar156._8_4_ = (int)auVar132._8_4_;
              auVar156._12_4_ = (int)auVar132._12_4_;
              auVar86 = vcvtdq2ps_avx(auVar156);
              auVar132 = vcmpps_avx(auVar132,auVar86,1);
              auVar132 = vandps_avx(auVar132,auVar84);
              auVar132 = vsubps_avx(auVar86,auVar132);
              auVar105._8_4_ = 0x3f318000;
              auVar105._0_8_ = 0x3f3180003f318000;
              auVar105._12_4_ = 0x3f318000;
              auVar86 = vfmsub231ps_fma(auVar142,auVar132,auVar105);
              auVar106._8_4_ = 0x395e8083;
              auVar106._0_8_ = 0x395e8083395e8083;
              auVar106._12_4_ = 0x395e8083;
              auVar142 = vfmsub231ps_fma(auVar86,auVar132,auVar106);
              auVar157._0_4_ = auVar142._0_4_ * auVar142._0_4_;
              auVar157._4_4_ = auVar142._4_4_ * auVar142._4_4_;
              auVar157._8_4_ = auVar142._8_4_ * auVar142._8_4_;
              auVar157._12_4_ = auVar142._12_4_ * auVar142._12_4_;
              auVar144._8_4_ = 0x39506967;
              auVar144._0_8_ = 0x3950696739506967;
              auVar144._12_4_ = 0x39506967;
              auVar107._8_4_ = 0x3ab743ce;
              auVar107._0_8_ = 0x3ab743ce3ab743ce;
              auVar107._12_4_ = 0x3ab743ce;
              auVar86 = vfmadd213ps_fma(auVar144,auVar142,auVar107);
              auVar108._8_4_ = 0x3c088908;
              auVar108._0_8_ = 0x3c0889083c088908;
              auVar108._12_4_ = 0x3c088908;
              auVar86 = vfmadd213ps_fma(auVar86,auVar142,auVar108);
              auVar78._8_4_ = 0x3d2aa9c1;
              auVar78._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar78._12_4_ = 0x3d2aa9c1;
              auVar86 = vfmadd213ps_fma(auVar86,auVar142,auVar78);
              auVar79._8_4_ = 0x3e2aaaaa;
              auVar79._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar79._12_4_ = 0x3e2aaaaa;
              auVar86 = vfmadd213ps_fma(auVar86,auVar142,auVar79);
              auVar102 = vfmadd213ps_fma(auVar86,auVar142,auVar102);
              auVar102 = vfmadd213ps_fma(auVar102,auVar157,auVar142);
              auVar90._0_4_ = auVar102._0_4_ + fVar75;
              auVar90._4_4_ = auVar102._4_4_ + fVar23;
              auVar90._8_4_ = auVar102._8_4_ + fVar24;
              auVar90._12_4_ = auVar102._12_4_ + fVar25;
              auVar145 = ZEXT864(0) << 0x20;
              auVar131._0_4_ = (int)auVar132._0_4_;
              auVar131._4_4_ = (int)auVar132._4_4_;
              auVar131._8_4_ = (int)auVar132._8_4_;
              auVar131._12_4_ = (int)auVar132._12_4_;
              auVar132 = vpslld_avx(auVar131,0x17);
              auVar132 = vpaddd_avx(auVar132,auVar84);
              auVar132 = vfmadd213ps_fma(auVar132,auVar90,auVar84);
              auVar92 = vdivps_avx(auVar84,auVar132);
              break;
            case 5:
              auVar146._8_4_ = 0x42b0c0a5;
              auVar146._0_8_ = 0x42b0c0a542b0c0a5;
              auVar146._12_4_ = 0x42b0c0a5;
              auVar86 = vminps_avx(auVar132,auVar146);
              auVar95 = vmaxps_avx(auVar148,auVar86);
              auVar149._8_4_ = 0x3fb8aa3b;
              auVar149._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar149._12_4_ = 0x3fb8aa3b;
              auVar86 = vfmadd213ps_fma(auVar149,auVar95,auVar102);
              auVar152._0_4_ = (int)auVar86._0_4_;
              auVar152._4_4_ = (int)auVar86._4_4_;
              auVar152._8_4_ = (int)auVar86._8_4_;
              auVar152._12_4_ = (int)auVar86._12_4_;
              auVar142 = vcvtdq2ps_avx(auVar152);
              auVar86 = vcmpps_avx(auVar86,auVar142,1);
              auVar86 = vandps_avx(auVar86,auVar84);
              auVar86 = vsubps_avx(auVar142,auVar86);
              auVar147._8_4_ = 0x3f318000;
              auVar147._0_8_ = 0x3f3180003f318000;
              auVar147._12_4_ = 0x3f318000;
              auVar142 = vfmsub231ps_fma(auVar95,auVar86,auVar147);
              auVar95 = vfnmsub231ps_fma(auVar142,auVar86,auVar126);
              auVar153._0_4_ = auVar95._0_4_ * auVar95._0_4_;
              auVar153._4_4_ = auVar95._4_4_ * auVar95._4_4_;
              auVar153._8_4_ = auVar95._8_4_ * auVar95._8_4_;
              auVar153._12_4_ = auVar95._12_4_ * auVar95._12_4_;
              auVar150._8_4_ = 0x39506967;
              auVar150._0_8_ = 0x3950696739506967;
              auVar150._12_4_ = 0x39506967;
              auVar112._8_4_ = 0x3ab743ce;
              auVar112._0_8_ = 0x3ab743ce3ab743ce;
              auVar112._12_4_ = 0x3ab743ce;
              auVar142 = vfmadd213ps_fma(auVar150,auVar95,auVar112);
              auVar128._8_4_ = 0x3c088908;
              auVar128._0_8_ = 0x3c0889083c088908;
              auVar128._12_4_ = 0x3c088908;
              auVar142 = vfmadd213ps_fma(auVar142,auVar95,auVar128);
              auVar129._8_4_ = 0x3d2aa9c1;
              auVar129._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar129._12_4_ = 0x3d2aa9c1;
              auVar142 = vfmadd213ps_fma(auVar142,auVar95,auVar129);
              auVar114._8_4_ = 0x3e2aaaaa;
              auVar114._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar114._12_4_ = 0x3e2aaaaa;
              auVar142 = vfmadd213ps_fma(auVar142,auVar95,auVar114);
              auVar142 = vfmadd213ps_fma(auVar142,auVar95,auVar102);
              auVar142 = vfmadd213ps_fma(auVar142,auVar153,auVar95);
              auVar96._0_4_ = auVar142._0_4_ + fVar75;
              auVar96._4_4_ = auVar142._4_4_ + fVar23;
              auVar96._8_4_ = auVar142._8_4_ + fVar24;
              auVar96._12_4_ = auVar142._12_4_ + fVar25;
              auVar85._0_4_ = (int)auVar86._0_4_;
              auVar85._4_4_ = (int)auVar86._4_4_;
              auVar85._8_4_ = (int)auVar86._8_4_;
              auVar85._12_4_ = (int)auVar86._12_4_;
              auVar86 = vpslld_avx(auVar85,0x17);
              auVar86 = vpaddd_avx(auVar86,auVar84);
              auVar122 = vfmadd213ps_fma(auVar86,auVar96,auVar84);
              auVar97._8_4_ = 0x800000;
              auVar97._0_8_ = 0x80000000800000;
              auVar97._12_4_ = 0x800000;
              auVar86 = vmaxps_avx(auVar122,auVar97);
              auVar142 = vpsrld_avx(auVar86,0x17);
              auVar115._8_4_ = 0xffffff82;
              auVar115._0_8_ = 0xffffff82ffffff82;
              auVar115._12_4_ = 0xffffff82;
              auVar142 = vpaddd_avx(auVar142,auVar115);
              auVar116._8_4_ = 0x807fffff;
              auVar116._0_8_ = 0x807fffff807fffff;
              auVar116._12_4_ = 0x807fffff;
              auVar86 = vandps_avx(auVar86,auVar116);
              auVar113 = vorps_avx(auVar86,auVar102);
              auVar95 = vcvtdq2ps_avx(auVar142);
              auVar117._8_4_ = 0x3f3504f3;
              auVar117._0_8_ = 0x3f3504f33f3504f3;
              auVar117._12_4_ = 0x3f3504f3;
              auVar142 = vcmpps_avx(auVar113,auVar117,1);
              auVar86 = vandps_avx(auVar142,auVar113);
              auVar98._0_4_ = auVar113._0_4_ + -1.0 + auVar86._0_4_;
              auVar98._4_4_ = auVar113._4_4_ + -1.0 + auVar86._4_4_;
              auVar98._8_4_ = auVar113._8_4_ + -1.0 + auVar86._8_4_;
              auVar98._12_4_ = auVar113._12_4_ + -1.0 + auVar86._12_4_;
              auVar86 = vandps_avx(auVar142,auVar84);
              auVar142 = vsubps_avx(auVar95,auVar86);
              auVar143._0_4_ = auVar98._0_4_ * auVar98._0_4_;
              auVar143._4_4_ = auVar98._4_4_ * auVar98._4_4_;
              auVar143._8_4_ = auVar98._8_4_ * auVar98._8_4_;
              auVar143._12_4_ = auVar98._12_4_ * auVar98._12_4_;
              auVar154._8_4_ = 0x3d9021bb;
              auVar154._0_8_ = 0x3d9021bb3d9021bb;
              auVar154._12_4_ = 0x3d9021bb;
              auVar133._8_4_ = 0xbdebd1b8;
              auVar133._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar133._12_4_ = 0xbdebd1b8;
              auVar86 = vfmadd213ps_fma(auVar154,auVar98,auVar133);
              auVar134._8_4_ = 0x3def251a;
              auVar134._0_8_ = 0x3def251a3def251a;
              auVar134._12_4_ = 0x3def251a;
              auVar86 = vfmadd213ps_fma(auVar86,auVar98,auVar134);
              auVar135._8_4_ = 0xbdfe5d4f;
              auVar135._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar135._12_4_ = 0xbdfe5d4f;
              auVar86 = vfmadd213ps_fma(auVar86,auVar98,auVar135);
              auVar136._8_4_ = 0x3e11e9bf;
              auVar136._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar136._12_4_ = 0x3e11e9bf;
              auVar86 = vfmadd213ps_fma(auVar86,auVar98,auVar136);
              auVar137._8_4_ = 0xbe2aae50;
              auVar137._0_8_ = 0xbe2aae50be2aae50;
              auVar137._12_4_ = 0xbe2aae50;
              auVar86 = vfmadd213ps_fma(auVar86,auVar98,auVar137);
              auVar138._8_4_ = 0x3e4cceac;
              auVar138._0_8_ = 0x3e4cceac3e4cceac;
              auVar138._12_4_ = 0x3e4cceac;
              auVar86 = vfmadd213ps_fma(auVar86,auVar98,auVar138);
              auVar139._8_4_ = 0xbe7ffffc;
              auVar139._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar139._12_4_ = 0xbe7ffffc;
              auVar86 = vfmadd213ps_fma(auVar86,auVar98,auVar139);
              auVar140._8_4_ = 0x3eaaaaaa;
              auVar140._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar140._12_4_ = 0x3eaaaaaa;
              auVar86 = vfmadd213ps_fma(auVar86,auVar98,auVar140);
              auVar141._0_4_ = auVar143._0_4_ * auVar98._0_4_ * auVar86._0_4_;
              auVar141._4_4_ = auVar143._4_4_ * auVar98._4_4_ * auVar86._4_4_;
              auVar141._8_4_ = auVar143._8_4_ * auVar98._8_4_ * auVar86._8_4_;
              auVar141._12_4_ = auVar143._12_4_ * auVar98._12_4_ * auVar86._12_4_;
              auVar86 = vfmadd231ps_fma(auVar141,auVar142,auVar126);
              auVar95 = vfmsub231ps_fma(auVar86,auVar102,auVar143);
              auVar28._12_4_ = 0;
              auVar28._0_12_ = ZEXT412(0);
              auVar145 = ZEXT1264(ZEXT412(0)) << 0x20;
              auVar86 = vcmpps_avx(auVar122,auVar28 << 0x20,2);
              auVar95 = vsubps_avx(auVar95,auVar98);
              auVar142 = vfnmadd231ps_fma(auVar95,auVar147,auVar142);
              auVar99._0_4_ = auVar142._0_4_ + auVar142._0_4_;
              auVar99._4_4_ = auVar142._4_4_ + auVar142._4_4_;
              auVar99._8_4_ = auVar142._8_4_ + auVar142._8_4_;
              auVar99._12_4_ = auVar142._12_4_ + auVar142._12_4_;
              auVar118._8_4_ = 0x7fffffff;
              auVar118._0_8_ = 0x7fffffff7fffffff;
              auVar118._12_4_ = 0x7fffffff;
              auVar86 = vblendvps_avx(auVar99,auVar118,auVar86);
              auVar100._8_4_ = 0x42b0c0a5;
              auVar100._0_8_ = 0x42b0c0a542b0c0a5;
              auVar100._12_4_ = 0x42b0c0a5;
              auVar86 = vminps_avx(auVar86,auVar100);
              auVar95 = vmaxps_avx(auVar148,auVar86);
              auVar86 = vfmadd213ps_fma(auVar149,auVar95,auVar102);
              auVar119._0_4_ = (int)auVar86._0_4_;
              auVar119._4_4_ = (int)auVar86._4_4_;
              auVar119._8_4_ = (int)auVar86._8_4_;
              auVar119._12_4_ = (int)auVar86._12_4_;
              auVar142 = vcvtdq2ps_avx(auVar119);
              auVar86 = vcmpps_avx(auVar86,auVar142,1);
              auVar86 = vandps_avx(auVar86,auVar84);
              auVar86 = vsubps_avx(auVar142,auVar86);
              auVar142 = vfmsub231ps_fma(auVar95,auVar86,auVar147);
              auVar95 = vfnmsub231ps_fma(auVar142,auVar86,auVar126);
              auVar120._0_4_ = auVar95._0_4_ * auVar95._0_4_;
              auVar120._4_4_ = auVar95._4_4_ * auVar95._4_4_;
              auVar120._8_4_ = auVar95._8_4_ * auVar95._8_4_;
              auVar120._12_4_ = auVar95._12_4_ * auVar95._12_4_;
              auVar142 = vfmadd213ps_fma(auVar150,auVar95,auVar112);
              auVar80 = ZEXT1664(auVar102);
              auVar123._8_4_ = 0x3c088908;
              auVar123._0_8_ = 0x3c0889083c088908;
              auVar123._12_4_ = 0x3c088908;
              auVar142 = vfmadd213ps_fma(auVar142,auVar95,auVar123);
              auVar142 = vfmadd213ps_fma(auVar142,auVar95,auVar129);
              auVar124._8_4_ = 0x3e2aaaaa;
              auVar124._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar124._12_4_ = 0x3e2aaaaa;
              auVar142 = vfmadd213ps_fma(auVar142,auVar95,auVar124);
              auVar102 = vfmadd213ps_fma(auVar142,auVar95,auVar102);
              auVar102 = vfmadd213ps_fma(auVar102,auVar120,auVar95);
              auVar121 = ZEXT1664(auVar84);
              auVar87._0_4_ = auVar102._0_4_ + fVar75;
              auVar87._4_4_ = auVar102._4_4_ + fVar23;
              auVar87._8_4_ = auVar102._8_4_ + fVar24;
              auVar87._12_4_ = auVar102._12_4_ + fVar25;
              auVar101._0_4_ = (int)auVar86._0_4_;
              auVar101._4_4_ = (int)auVar86._4_4_;
              auVar101._8_4_ = (int)auVar86._8_4_;
              auVar101._12_4_ = (int)auVar86._12_4_;
              auVar102 = vpslld_avx(auVar101,0x17);
              auVar102 = vpaddd_avx(auVar102,auVar84);
              auVar102 = vfmadd213ps_fma(auVar102,auVar87,auVar84);
              auVar77._8_4_ = 0x40000000;
              auVar77._0_8_ = 0x4000000040000000;
              auVar77._12_4_ = 0x40000000;
              auVar102 = vdivps_avx(auVar77,auVar102);
              auVar92 = vfmsub213ps_fma(auVar102,auVar132,auVar132);
              break;
            case 6:
              puVar22 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
              uVar3 = *puVar22;
              auVar91._4_4_ = uVar3;
              auVar91._0_4_ = uVar3;
              auVar91._8_4_ = uVar3;
              auVar91._12_4_ = uVar3;
              uVar3 = puVar22[1];
              auVar109._4_4_ = uVar3;
              auVar109._0_4_ = uVar3;
              auVar109._8_4_ = uVar3;
              auVar109._12_4_ = uVar3;
              auVar102 = vfmadd231ps_fma(auVar109,auVar132,auVar91);
              auVar102 = vmaxps_avx(auVar86,auVar102);
              auVar102 = vminps_avx(auVar102,auVar84);
              auVar92._0_4_ = auVar132._0_4_ * auVar102._0_4_;
              auVar92._4_4_ = auVar132._4_4_ * auVar102._4_4_;
              auVar92._8_4_ = auVar132._8_4_ * auVar102._8_4_;
              auVar92._12_4_ = auVar132._12_4_ * auVar102._12_4_;
            }
          }
          *(undefined1 (*) [16])((long)pvVar61 + lVar44 * 0x10) = auVar92;
        }
        pvVar61 = (void *)((long)pvVar61 + (long)((int)local_258 << 2) * 4);
      }
      uVar57 = (ulong)((int)uVar57 + (uint)local_248);
    }
LAB_003ad1a7:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  iVar52 = 0;
LAB_003ad28c:
  piVar20 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_2a8.allocator == (Allocator *)0x0) {
        free(local_2a8.data);
      }
      else {
        (*(local_2a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar52;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}